

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  byte bVar67;
  ulong uVar68;
  ulong uVar69;
  byte bVar70;
  Primitive *pPVar71;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar72;
  byte bVar73;
  long lVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  byte bVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar90 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float pp;
  float fVar138;
  undefined4 uVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar153;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar163 [32];
  undefined1 auVar154 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar229 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined4 uVar236;
  undefined4 uVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  uint local_9d0;
  int local_9cc;
  float local_9c8;
  float local_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  Primitive *local_618;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar69 = (ulong)(byte)PVar6;
  lVar74 = uVar69 * 0x19;
  fVar206 = *(float *)(prim + lVar74 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar90 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar74 + 6));
  fVar205 = fVar206 * auVar90._0_4_;
  fVar138 = fVar206 * auVar89._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar81);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar69 + 6);
  auVar95 = vpmovsxbd_avx2(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar68 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar100 = vpmovsxbd_avx2(auVar88);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar68 + uVar69 + 6);
  auVar101 = vpmovsxbd_avx2(auVar82);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar78 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar93 = vpmovsxbd_avx2(auVar251);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar113._4_4_ = fVar138;
  auVar113._0_4_ = fVar138;
  auVar113._8_4_ = fVar138;
  auVar113._12_4_ = fVar138;
  auVar113._16_4_ = fVar138;
  auVar113._20_4_ = fVar138;
  auVar113._24_4_ = fVar138;
  auVar113._28_4_ = fVar138;
  auVar114._8_4_ = 1;
  auVar114._0_8_ = 0x100000001;
  auVar114._12_4_ = 1;
  auVar114._16_4_ = 1;
  auVar114._20_4_ = 1;
  auVar114._24_4_ = 1;
  auVar114._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar206 * auVar89._12_4_,
                                CONCAT48(fVar206 * auVar89._8_4_,
                                         CONCAT44(fVar206 * auVar89._4_4_,fVar138))));
  auVar104 = vpermps_avx2(auVar114,auVar105);
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar138 = auVar92._0_4_;
  fVar167 = auVar92._4_4_;
  auVar105._4_4_ = fVar167 * auVar97._4_4_;
  auVar105._0_4_ = fVar138 * auVar97._0_4_;
  fVar169 = auVar92._8_4_;
  auVar105._8_4_ = fVar169 * auVar97._8_4_;
  fVar171 = auVar92._12_4_;
  auVar105._12_4_ = fVar171 * auVar97._12_4_;
  fVar152 = auVar92._16_4_;
  auVar105._16_4_ = fVar152 * auVar97._16_4_;
  fVar173 = auVar92._20_4_;
  auVar105._20_4_ = fVar173 * auVar97._20_4_;
  fVar175 = auVar92._24_4_;
  auVar105._24_4_ = fVar175 * auVar97._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar167;
  auVar103._0_4_ = auVar95._0_4_ * fVar138;
  auVar103._8_4_ = auVar95._8_4_ * fVar169;
  auVar103._12_4_ = auVar95._12_4_ * fVar171;
  auVar103._16_4_ = auVar95._16_4_ * fVar152;
  auVar103._20_4_ = auVar95._20_4_ * fVar173;
  auVar103._24_4_ = auVar95._24_4_ * fVar175;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar167;
  auVar93._0_4_ = auVar102._0_4_ * fVar138;
  auVar93._8_4_ = auVar102._8_4_ * fVar169;
  auVar93._12_4_ = auVar102._12_4_ * fVar171;
  auVar93._16_4_ = auVar102._16_4_ * fVar152;
  auVar93._20_4_ = auVar102._20_4_ * fVar173;
  auVar93._24_4_ = auVar102._24_4_ * fVar175;
  auVar93._28_4_ = auVar92._28_4_;
  auVar83 = vfmadd231ps_fma(auVar105,auVar104,auVar94);
  auVar86 = vfmadd231ps_fma(auVar103,auVar104,auVar99);
  auVar84 = vfmadd231ps_fma(auVar93,auVar101,auVar104);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar113,auVar96);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar113,auVar98);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar100,auVar113);
  auVar216._4_4_ = fVar205;
  auVar216._0_4_ = fVar205;
  auVar216._8_4_ = fVar205;
  auVar216._12_4_ = fVar205;
  auVar216._16_4_ = fVar205;
  auVar216._20_4_ = fVar205;
  auVar216._24_4_ = fVar205;
  auVar216._28_4_ = fVar205;
  auVar93 = ZEXT1632(CONCAT412(fVar206 * auVar90._12_4_,
                               CONCAT48(fVar206 * auVar90._8_4_,
                                        CONCAT44(fVar206 * auVar90._4_4_,fVar205))));
  auVar103 = vpermps_avx2(auVar114,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar206 = auVar93._0_4_;
  fVar138 = auVar93._4_4_;
  auVar104._4_4_ = fVar138 * auVar97._4_4_;
  auVar104._0_4_ = fVar206 * auVar97._0_4_;
  fVar167 = auVar93._8_4_;
  auVar104._8_4_ = fVar167 * auVar97._8_4_;
  fVar169 = auVar93._12_4_;
  auVar104._12_4_ = fVar169 * auVar97._12_4_;
  fVar171 = auVar93._16_4_;
  auVar104._16_4_ = fVar171 * auVar97._16_4_;
  fVar152 = auVar93._20_4_;
  auVar104._20_4_ = fVar152 * auVar97._20_4_;
  fVar173 = auVar93._24_4_;
  auVar104._24_4_ = fVar173 * auVar97._24_4_;
  auVar104._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar138;
  auVar91._0_4_ = auVar95._0_4_ * fVar206;
  auVar91._8_4_ = auVar95._8_4_ * fVar167;
  auVar91._12_4_ = auVar95._12_4_ * fVar169;
  auVar91._16_4_ = auVar95._16_4_ * fVar171;
  auVar91._20_4_ = auVar95._20_4_ * fVar152;
  auVar91._24_4_ = auVar95._24_4_ * fVar173;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar138;
  auVar95._0_4_ = auVar102._0_4_ * fVar206;
  auVar95._8_4_ = auVar102._8_4_ * fVar167;
  auVar95._12_4_ = auVar102._12_4_ * fVar169;
  auVar95._16_4_ = auVar102._16_4_ * fVar171;
  auVar95._20_4_ = auVar102._20_4_ * fVar152;
  auVar95._24_4_ = auVar102._24_4_ * fVar173;
  auVar95._28_4_ = auVar93._28_4_;
  auVar85 = vfmadd231ps_fma(auVar104,auVar103,auVar94);
  auVar81 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar87 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar216,auVar96);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar216,auVar98);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar216,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar83),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar9 = (bool)((byte)uVar68 & 1);
  auVar92._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar83._0_4_;
  bVar9 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar83._4_4_;
  bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar83._8_4_;
  bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar83._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar110);
  uVar68 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar9 = (bool)((byte)uVar68 & 1);
  auVar106._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._0_4_;
  bVar9 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._4_4_;
  bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._8_4_;
  bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar84),auVar110);
  uVar68 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar9 = (bool)((byte)uVar68 & 1);
  auVar96._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar84._0_4_;
  bVar9 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar84._4_4_;
  bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar84._8_4_;
  bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar84._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar106);
  auVar86 = vfnmadd213ps_fma(auVar106,auVar94,auVar111);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar84 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar100._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar109._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar69 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar101._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar108._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 + uVar69 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar102._4_4_ = auVar96._4_4_ * auVar84._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar84._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar84._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar84._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar107._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar107._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar107._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar107._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar107._16_4_ = auVar96._16_4_ * 0.0;
  auVar107._20_4_ = auVar96._20_4_ * 0.0;
  auVar107._24_4_ = auVar96._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  auVar94 = vpminsd_avx2(auVar101,auVar108);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar107);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar5;
  auVar97._0_4_ = uVar5;
  auVar97._8_4_ = uVar5;
  auVar97._12_4_ = uVar5;
  auVar97._16_4_ = uVar5;
  auVar97._20_4_ = uVar5;
  auVar97._24_4_ = uVar5;
  auVar97._28_4_ = uVar5;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  auVar94 = vpmaxsd_avx2(auVar101,auVar108);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar107);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar5;
  auVar98._0_4_ = uVar5;
  auVar98._8_4_ = uVar5;
  auVar98._12_4_ = uVar5;
  auVar98._16_4_ = uVar5;
  auVar98._20_4_ = uVar5;
  auVar98._24_4_ = uVar5;
  auVar98._28_4_ = uVar5;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar19 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_280,auVar96,2);
  if ((byte)((byte)uVar17 & (byte)uVar19) == 0) {
    return;
  }
  local_608 = (ulong)(byte)((byte)uVar17 & (byte)uVar19);
  pPVar71 = prim + lVar74 + 0x16;
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_618 = pPVar71;
  local_610 = prim;
LAB_01c6ea9f:
  lVar74 = 0;
  for (uVar68 = local_608; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar74 = lVar74 + 1;
  }
  local_608 = local_608 - 1 & local_608;
  uVar5 = *(undefined4 *)(prim + lVar74 * 4 + 6);
  uVar68 = (ulong)(uint)((int)lVar74 << 6);
  auVar83 = *(undefined1 (*) [16])(pPVar71 + uVar68);
  if (local_608 != 0) {
    uVar69 = local_608 - 1 & local_608;
    for (uVar78 = local_608; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    }
    if (uVar69 != 0) {
      for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar86 = *(undefined1 (*) [16])(pPVar71 + uVar68 + 0x10);
  auVar84 = *(undefined1 (*) [16])(pPVar71 + uVar68 + 0x20);
  auVar85 = *(undefined1 (*) [16])(pPVar71 + uVar68 + 0x30);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar87 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar81 = vunpcklps_avx512vl(local_3a0._0_16_,local_3c0._0_16_);
  local_720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar252 = ZEXT3264(local_720);
  auVar251 = local_720._0_16_;
  local_730 = vinsertps_avx512f(auVar81,auVar251,0x28);
  auVar90._0_4_ = auVar83._0_4_ + auVar86._0_4_ + auVar84._0_4_ + auVar85._0_4_;
  auVar90._4_4_ = auVar83._4_4_ + auVar86._4_4_ + auVar84._4_4_ + auVar85._4_4_;
  auVar90._8_4_ = auVar83._8_4_ + auVar86._8_4_ + auVar84._8_4_ + auVar85._8_4_;
  auVar90._12_4_ = auVar83._12_4_ + auVar86._12_4_ + auVar84._12_4_ + auVar85._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar90,auVar89);
  auVar81 = vsubps_avx(auVar81,auVar87);
  auVar81 = vdpps_avx(auVar81,local_730,0x7f);
  fVar206 = *(float *)(ray + k * 4 + 0x30);
  local_740 = vdpps_avx(local_730,local_730,0x7f);
  uVar72 = *(uint *)(prim + 2);
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = local_740._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
  auVar88 = vfnmadd213ss_fma(auVar82,local_740,ZEXT416(0x40000000));
  local_260 = auVar81._0_4_ * auVar82._0_4_ * auVar88._0_4_;
  auVar224._4_4_ = local_260;
  auVar224._0_4_ = local_260;
  auVar224._8_4_ = local_260;
  auVar224._12_4_ = local_260;
  fStack_6d0 = local_260;
  _local_6e0 = auVar224;
  fStack_6cc = local_260;
  fStack_6c8 = local_260;
  fStack_6c4 = local_260;
  auVar81 = vfmadd231ps_fma(auVar87,local_730,auVar224);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar86 = vsubps_avx(auVar86,auVar81);
  auVar85 = vsubps_avx(auVar85,auVar81);
  uVar139 = auVar83._0_4_;
  local_8c0._4_4_ = uVar139;
  local_8c0._0_4_ = uVar139;
  local_8c0._8_4_ = uVar139;
  local_8c0._12_4_ = uVar139;
  local_8c0._16_4_ = uVar139;
  local_8c0._20_4_ = uVar139;
  local_8c0._24_4_ = uVar139;
  local_8c0._28_4_ = uVar139;
  auVar235 = ZEXT3264(local_8c0);
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  local_580 = ZEXT1632(auVar83);
  local_8e0 = vpermps_avx512vl(auVar118,local_580);
  auVar256 = ZEXT3264(local_8e0);
  auVar119._8_4_ = 2;
  auVar119._0_8_ = 0x200000002;
  auVar119._12_4_ = 2;
  auVar119._16_4_ = 2;
  auVar119._20_4_ = 2;
  auVar119._24_4_ = 2;
  auVar119._28_4_ = 2;
  local_7e0 = vpermps_avx2(auVar119,local_580);
  auVar241 = ZEXT3264(local_7e0);
  auVar198._8_4_ = 3;
  auVar198._0_8_ = 0x300000003;
  auVar198._12_4_ = 3;
  auVar198._16_4_ = 3;
  auVar198._20_4_ = 3;
  auVar198._24_4_ = 3;
  auVar198._28_4_ = 3;
  local_800 = vpermps_avx2(auVar198,local_580);
  auVar242 = ZEXT3264(local_800);
  uVar139 = auVar86._0_4_;
  local_560._4_4_ = uVar139;
  local_560._0_4_ = uVar139;
  local_560._8_4_ = uVar139;
  local_560._12_4_ = uVar139;
  local_560._16_4_ = uVar139;
  local_560._20_4_ = uVar139;
  local_560._24_4_ = uVar139;
  local_560._28_4_ = uVar139;
  auVar231 = ZEXT3264(local_560);
  local_5c0 = ZEXT1632(auVar86);
  local_700 = vpermps_avx2(auVar118,local_5c0);
  auVar217 = ZEXT3264(local_700);
  local_900 = vpermps_avx512vl(auVar119,local_5c0);
  auVar243 = ZEXT3264(local_900);
  local_920 = vpermps_avx512vl(auVar198,local_5c0);
  auVar244 = ZEXT3264(local_920);
  local_940 = vbroadcastss_avx512vl(auVar84);
  auVar245 = ZEXT3264(local_940);
  local_5a0 = ZEXT1632(auVar84);
  local_820 = vpermps_avx512vl(auVar118,local_5a0);
  auVar246 = ZEXT3264(local_820);
  local_960 = vpermps_avx512vl(auVar119,local_5a0);
  auVar247 = ZEXT3264(local_960);
  local_840 = vpermps_avx512vl(auVar198,local_5a0);
  auVar248 = ZEXT3264(local_840);
  local_980 = vbroadcastss_avx512vl(auVar85);
  auVar249 = ZEXT3264(local_980);
  _local_5e0 = ZEXT1632(auVar85);
  local_860 = vpermps_avx512vl(auVar118,_local_5e0);
  auVar250 = ZEXT3264(local_860);
  local_9a0 = vpermps_avx512vl(auVar119,_local_5e0);
  auVar253 = ZEXT3264(local_9a0);
  local_9c0 = vpermps_avx512vl(auVar198,_local_5e0);
  auVar254 = ZEXT3264(local_9c0);
  auVar83 = vmulss_avx512f(auVar251,auVar251);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),local_3c0,local_3c0);
  local_240 = vfmadd231ps_avx512vl(auVar96,local_3a0,local_3a0);
  uVar139 = local_240._0_4_;
  local_220._4_4_ = uVar139;
  local_220._0_4_ = uVar139;
  local_220._8_4_ = uVar139;
  local_220._12_4_ = uVar139;
  local_220._16_4_ = uVar139;
  local_220._20_4_ = uVar139;
  local_220._24_4_ = uVar139;
  local_220._28_4_ = uVar139;
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar115);
  local_670 = ZEXT416((uint)local_260);
  local_260 = fVar206 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  local_9cc = 1;
  uVar68 = 0;
  local_480 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_740,local_740);
  local_9c4 = auVar83._0_4_;
  auVar83 = vsqrtss_avx(local_740,local_740);
  local_9c8 = auVar83._0_4_;
  local_330 = ZEXT816(0x3f80000000000000);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar255 = ZEXT3264(auVar96);
  do {
    auVar83 = vmovshdup_avx(local_330);
    auVar83 = vsubps_avx(auVar83,local_330);
    fVar138 = auVar83._0_4_;
    fVar152 = fVar138 * 0.04761905;
    auVar209._0_4_ = local_330._0_4_;
    auVar209._4_4_ = auVar209._0_4_;
    auVar209._8_4_ = auVar209._0_4_;
    auVar209._12_4_ = auVar209._0_4_;
    auVar209._16_4_ = auVar209._0_4_;
    auVar209._20_4_ = auVar209._0_4_;
    auVar209._24_4_ = auVar209._0_4_;
    auVar209._28_4_ = auVar209._0_4_;
    local_760._4_4_ = fVar138;
    local_760._0_4_ = fVar138;
    local_760._8_4_ = fVar138;
    local_760._12_4_ = fVar138;
    local_760._16_4_ = fVar138;
    local_760._20_4_ = fVar138;
    local_760._24_4_ = fVar138;
    local_760._28_4_ = fVar138;
    auVar83 = vfmadd231ps_fma(auVar209,local_760,_DAT_01faff20);
    auVar114 = auVar255._0_32_;
    auVar96 = vsubps_avx512vl(auVar114,ZEXT1632(auVar83));
    fVar138 = auVar83._0_4_;
    fVar167 = auVar83._4_4_;
    auVar65._4_4_ = auVar231._4_4_ * fVar167;
    auVar65._0_4_ = auVar231._0_4_ * fVar138;
    fVar169 = auVar83._8_4_;
    auVar65._8_4_ = auVar231._8_4_ * fVar169;
    fVar171 = auVar83._12_4_;
    auVar65._12_4_ = auVar231._12_4_ * fVar171;
    auVar65._16_4_ = auVar231._16_4_ * 0.0;
    auVar65._20_4_ = auVar231._20_4_ * 0.0;
    auVar65._24_4_ = auVar231._24_4_ * 0.0;
    auVar65._28_4_ = DAT_01faff20._28_4_;
    auVar99 = ZEXT1632(auVar83);
    auVar43._4_4_ = auVar217._4_4_ * fVar167;
    auVar43._0_4_ = auVar217._0_4_ * fVar138;
    auVar43._8_4_ = auVar217._8_4_ * fVar169;
    auVar43._12_4_ = auVar217._12_4_ * fVar171;
    auVar43._16_4_ = auVar217._16_4_ * 0.0;
    auVar43._20_4_ = auVar217._20_4_ * 0.0;
    auVar43._24_4_ = auVar217._24_4_ * 0.0;
    auVar43._28_4_ = auVar209._0_4_;
    auVar94 = vmulps_avx512vl(auVar243._0_32_,auVar99);
    auVar97 = vmulps_avx512vl(auVar244._0_32_,auVar99);
    auVar86 = vfmadd231ps_fma(auVar65,auVar96,auVar235._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar43,auVar96,auVar256._0_32_);
    auVar84 = vfmadd231ps_fma(auVar94,auVar96,auVar241._0_32_);
    auVar85 = vfmadd231ps_fma(auVar97,auVar96,auVar242._0_32_);
    auVar94 = vmulps_avx512vl(auVar245._0_32_,auVar99);
    auVar102 = ZEXT1632(auVar83);
    auVar97 = vmulps_avx512vl(auVar246._0_32_,auVar102);
    auVar99 = vmulps_avx512vl(auVar247._0_32_,auVar102);
    auVar95 = vmulps_avx512vl(auVar248._0_32_,auVar102);
    auVar81 = vfmadd231ps_fma(auVar94,auVar96,auVar231._0_32_);
    auVar87 = vfmadd231ps_fma(auVar97,auVar96,auVar217._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar243._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar244._0_32_);
    auVar99 = vmulps_avx512vl(auVar249._0_32_,auVar102);
    auVar95 = vmulps_avx512vl(auVar250._0_32_,auVar102);
    auVar100 = vmulps_avx512vl(auVar253._0_32_,auVar102);
    auVar101 = vmulps_avx512vl(auVar254._0_32_,auVar102);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar245._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar246._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar247._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar248._0_32_);
    auVar44._28_4_ = auVar217._28_4_;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar171 * auVar81._12_4_,
                            CONCAT48(fVar169 * auVar81._8_4_,
                                     CONCAT44(fVar167 * auVar81._4_4_,fVar138 * auVar81._0_4_))));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar87));
    auVar103 = vmulps_avx512vl(ZEXT1632(auVar83),auVar94);
    auVar93 = vmulps_avx512vl(ZEXT1632(auVar83),auVar97);
    auVar83 = vfmadd231ps_fma(auVar44,auVar96,ZEXT1632(auVar86));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar98);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar84));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,ZEXT1632(auVar85));
    auVar229._0_4_ = auVar99._0_4_ * fVar138;
    auVar229._4_4_ = auVar99._4_4_ * fVar167;
    auVar229._8_4_ = auVar99._8_4_ * fVar169;
    auVar229._12_4_ = auVar99._12_4_ * fVar171;
    auVar229._16_4_ = auVar99._16_4_ * 0.0;
    auVar229._20_4_ = auVar99._20_4_ * 0.0;
    auVar229._24_4_ = auVar99._24_4_ * 0.0;
    auVar229._28_4_ = 0;
    auVar45._4_4_ = auVar95._4_4_ * fVar167;
    auVar45._0_4_ = auVar95._0_4_ * fVar138;
    auVar45._8_4_ = auVar95._8_4_ * fVar169;
    auVar45._12_4_ = auVar95._12_4_ * fVar171;
    auVar45._16_4_ = auVar95._16_4_ * 0.0;
    auVar45._20_4_ = auVar95._20_4_ * 0.0;
    auVar45._24_4_ = auVar95._24_4_ * 0.0;
    auVar45._28_4_ = auVar99._28_4_;
    auVar46._4_4_ = auVar100._4_4_ * fVar167;
    auVar46._0_4_ = auVar100._0_4_ * fVar138;
    auVar46._8_4_ = auVar100._8_4_ * fVar169;
    auVar46._12_4_ = auVar100._12_4_ * fVar171;
    auVar46._16_4_ = auVar100._16_4_ * 0.0;
    auVar46._20_4_ = auVar100._20_4_ * 0.0;
    auVar46._24_4_ = auVar100._24_4_ * 0.0;
    auVar46._28_4_ = auVar95._28_4_;
    auVar47._4_4_ = auVar101._4_4_ * fVar167;
    auVar47._0_4_ = auVar101._0_4_ * fVar138;
    auVar47._8_4_ = auVar101._8_4_ * fVar169;
    auVar47._12_4_ = auVar101._12_4_ * fVar171;
    auVar47._16_4_ = auVar101._16_4_ * 0.0;
    auVar47._20_4_ = auVar101._20_4_ * 0.0;
    auVar47._24_4_ = auVar101._24_4_ * 0.0;
    auVar47._28_4_ = auVar100._28_4_;
    auVar86 = vfmadd231ps_fma(auVar229,auVar96,ZEXT1632(auVar81));
    auVar84 = vfmadd231ps_fma(auVar45,auVar96,ZEXT1632(auVar87));
    auVar85 = vfmadd231ps_fma(auVar46,auVar96,auVar94);
    auVar81 = vfmadd231ps_fma(auVar47,auVar96,auVar97);
    auVar48._28_4_ = auVar98._28_4_;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar171,
                            CONCAT48(auVar84._8_4_ * fVar169,
                                     CONCAT44(auVar84._4_4_ * fVar167,auVar84._0_4_ * fVar138))));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar171 * auVar86._12_4_,
                                                 CONCAT48(fVar169 * auVar86._8_4_,
                                                          CONCAT44(fVar167 * auVar86._4_4_,
                                                                   fVar138 * auVar86._0_4_)))),
                              auVar96,ZEXT1632(auVar83));
    auVar95 = vfmadd231ps_avx512vl(auVar48,auVar96,auVar102);
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar85._12_4_ * fVar171,
                                             CONCAT48(auVar85._8_4_ * fVar169,
                                                      CONCAT44(auVar85._4_4_ * fVar167,
                                                               auVar85._0_4_ * fVar138)))),auVar96,
                          auVar103);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar171,
                                            CONCAT48(auVar81._8_4_ * fVar169,
                                                     CONCAT44(auVar81._4_4_ * fVar167,
                                                              auVar81._0_4_ * fVar138)))),auVar93,
                         auVar96);
    auVar96 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar83));
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar84),auVar102);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar85),auVar103);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar81),auVar93);
    auVar239._0_4_ = fVar152 * auVar96._0_4_ * 3.0;
    auVar239._4_4_ = fVar152 * auVar96._4_4_ * 3.0;
    auVar239._8_4_ = fVar152 * auVar96._8_4_ * 3.0;
    auVar239._12_4_ = fVar152 * auVar96._12_4_ * 3.0;
    auVar239._16_4_ = fVar152 * auVar96._16_4_ * 3.0;
    auVar239._20_4_ = fVar152 * auVar96._20_4_ * 3.0;
    auVar239._24_4_ = fVar152 * auVar96._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    auVar240._0_4_ = fVar152 * auVar97._0_4_ * 3.0;
    auVar240._4_4_ = fVar152 * auVar97._4_4_ * 3.0;
    auVar240._8_4_ = fVar152 * auVar97._8_4_ * 3.0;
    auVar240._12_4_ = fVar152 * auVar97._12_4_ * 3.0;
    auVar240._16_4_ = fVar152 * auVar97._16_4_ * 3.0;
    auVar240._20_4_ = fVar152 * auVar97._20_4_ * 3.0;
    auVar240._24_4_ = fVar152 * auVar97._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar49._4_4_ = fVar152 * auVar98._4_4_ * 3.0;
    auVar49._0_4_ = fVar152 * auVar98._0_4_ * 3.0;
    auVar49._8_4_ = fVar152 * auVar98._8_4_ * 3.0;
    auVar49._12_4_ = fVar152 * auVar98._12_4_ * 3.0;
    auVar49._16_4_ = fVar152 * auVar98._16_4_ * 3.0;
    auVar49._20_4_ = fVar152 * auVar98._20_4_ * 3.0;
    auVar49._24_4_ = fVar152 * auVar98._24_4_ * 3.0;
    auVar49._28_4_ = auVar101._28_4_;
    fVar138 = auVar99._0_4_ * 3.0 * fVar152;
    fVar167 = auVar99._4_4_ * 3.0 * fVar152;
    auVar50._4_4_ = fVar167;
    auVar50._0_4_ = fVar138;
    fVar169 = auVar99._8_4_ * 3.0 * fVar152;
    auVar50._8_4_ = fVar169;
    fVar171 = auVar99._12_4_ * 3.0 * fVar152;
    auVar50._12_4_ = fVar171;
    fVar173 = auVar99._16_4_ * 3.0 * fVar152;
    auVar50._16_4_ = fVar173;
    fVar175 = auVar99._20_4_ * 3.0 * fVar152;
    auVar50._20_4_ = fVar175;
    fVar205 = auVar99._24_4_ * 3.0 * fVar152;
    auVar50._24_4_ = fVar205;
    auVar50._28_4_ = fVar152;
    auVar83 = vxorps_avx512vl(auVar256._0_16_,auVar256._0_16_);
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_01feed00,ZEXT1632(auVar83));
    auVar102 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar83));
    auVar97 = ZEXT1632(auVar83);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar97);
    auVar222._0_4_ = auVar94._0_4_ + fVar138;
    auVar222._4_4_ = auVar94._4_4_ + fVar167;
    auVar222._8_4_ = auVar94._8_4_ + fVar169;
    auVar222._12_4_ = auVar94._12_4_ + fVar171;
    auVar222._16_4_ = auVar94._16_4_ + fVar173;
    auVar222._20_4_ = auVar94._20_4_ + fVar175;
    auVar222._24_4_ = auVar94._24_4_ + fVar205;
    auVar222._28_4_ = auVar94._28_4_ + fVar152;
    auVar96 = vmaxps_avx(auVar94,auVar222);
    auVar93 = vminps_avx512vl(auVar94,auVar222);
    auVar104 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,auVar97);
    auVar105 = vpermt2ps_avx512vl(auVar239,_DAT_01feed00,auVar97);
    auVar91 = vpermt2ps_avx512vl(auVar240,_DAT_01feed00,auVar97);
    auVar115 = ZEXT1632(auVar83);
    auVar92 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar115);
    auVar94 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar115);
    auVar94 = vsubps_avx(auVar104,auVar94);
    auVar97 = vsubps_avx(auVar101,ZEXT1632(auVar87));
    auVar98 = vsubps_avx(auVar102,auVar95);
    auVar99 = vsubps_avx(auVar103,auVar100);
    auVar106 = vmulps_avx512vl(auVar98,auVar49);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar240,auVar99);
    auVar107 = vmulps_avx512vl(auVar99,auVar239);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar49,auVar97);
    auVar108 = vmulps_avx512vl(auVar97,auVar240);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar239,auVar98);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar99,auVar99);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar98);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar97);
    auVar108 = vrcp14ps_avx512vl(auVar107);
    auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar114);
    auVar108 = vfmadd132ps_avx512vl(auVar109,auVar108,auVar108);
    auVar106 = vmulps_avx512vl(auVar106,auVar108);
    auVar109 = vmulps_avx512vl(auVar98,auVar92);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar91,auVar99);
    auVar110 = vmulps_avx512vl(auVar99,auVar105);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar92,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar91);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar105,auVar98);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar106 = vmaxps_avx512vl(auVar106,auVar108);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar108 = vmaxps_avx512vl(auVar94,auVar104);
    auVar96 = vmaxps_avx512vl(auVar96,auVar108);
    auVar108 = vaddps_avx512vl(auVar106,auVar96);
    auVar96 = vminps_avx(auVar94,auVar104);
    auVar96 = vminps_avx512vl(auVar93,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar106);
    auVar31._8_4_ = 0x3f800002;
    auVar31._0_8_ = 0x3f8000023f800002;
    auVar31._12_4_ = 0x3f800002;
    auVar31._16_4_ = 0x3f800002;
    auVar31._20_4_ = 0x3f800002;
    auVar31._24_4_ = 0x3f800002;
    auVar31._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar108,auVar31);
    auVar32._8_4_ = 0x3f7ffffc;
    auVar32._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar32._12_4_ = 0x3f7ffffc;
    auVar32._16_4_ = 0x3f7ffffc;
    auVar32._20_4_ = 0x3f7ffffc;
    auVar32._24_4_ = 0x3f7ffffc;
    auVar32._28_4_ = 0x3f7ffffc;
    local_7a0 = vmulps_avx512vl(auVar96,auVar32);
    auVar96 = vmulps_avx512vl(auVar94,auVar94);
    auVar94 = vrsqrt14ps_avx512vl(auVar107);
    auVar33._8_4_ = 0xbf000000;
    auVar33._0_8_ = 0xbf000000bf000000;
    auVar33._12_4_ = 0xbf000000;
    auVar33._16_4_ = 0xbf000000;
    auVar33._20_4_ = 0xbf000000;
    auVar33._24_4_ = 0xbf000000;
    auVar33._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar107,auVar33);
    fVar138 = auVar94._0_4_;
    fVar167 = auVar94._4_4_;
    fVar169 = auVar94._8_4_;
    fVar171 = auVar94._12_4_;
    fVar152 = auVar94._16_4_;
    fVar173 = auVar94._20_4_;
    fVar175 = auVar94._24_4_;
    auVar51._4_4_ = fVar167 * fVar167 * fVar167 * auVar93._4_4_;
    auVar51._0_4_ = fVar138 * fVar138 * fVar138 * auVar93._0_4_;
    auVar51._8_4_ = fVar169 * fVar169 * fVar169 * auVar93._8_4_;
    auVar51._12_4_ = fVar171 * fVar171 * fVar171 * auVar93._12_4_;
    auVar51._16_4_ = fVar152 * fVar152 * fVar152 * auVar93._16_4_;
    auVar51._20_4_ = fVar173 * fVar173 * fVar173 * auVar93._20_4_;
    auVar51._24_4_ = fVar175 * fVar175 * fVar175 * auVar93._24_4_;
    auVar51._28_4_ = auVar108._28_4_;
    auVar34._8_4_ = 0x3fc00000;
    auVar34._0_8_ = 0x3fc000003fc00000;
    auVar34._12_4_ = 0x3fc00000;
    auVar34._16_4_ = 0x3fc00000;
    auVar34._20_4_ = 0x3fc00000;
    auVar34._24_4_ = 0x3fc00000;
    auVar34._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar51,auVar94,auVar34);
    auVar93 = vmulps_avx512vl(auVar97,auVar94);
    auVar104 = vmulps_avx512vl(auVar98,auVar94);
    auVar106 = vmulps_avx512vl(auVar99,auVar94);
    auVar216 = ZEXT1632(auVar87);
    auVar107 = vsubps_avx512vl(auVar115,auVar216);
    auVar108 = vsubps_avx512vl(auVar115,auVar95);
    auVar109 = vsubps_avx512vl(auVar115,auVar100);
    auVar110 = vmulps_avx512vl(auVar252._0_32_,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_3c0,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_3a0,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(auVar252._0_32_,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,local_3c0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar93,local_3a0);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar104 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar104);
    auVar93 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar93);
    auVar104 = vmulps_avx512vl(auVar112,auVar112);
    auVar106 = vsubps_avx512vl(local_220,auVar104);
    auVar113 = vmulps_avx512vl(auVar112,auVar93);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar93,auVar93);
    local_7c0 = vsubps_avx512vl(auVar111,auVar113);
    auVar96 = vsubps_avx512vl(local_7c0,auVar96);
    local_6a0 = vmulps_avx512vl(auVar110,auVar110);
    auVar35._8_4_ = 0x40800000;
    auVar35._0_8_ = 0x4080000040800000;
    auVar35._12_4_ = 0x40800000;
    auVar35._16_4_ = 0x40800000;
    auVar35._20_4_ = 0x40800000;
    auVar35._24_4_ = 0x40800000;
    auVar35._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar106,auVar35);
    auVar111 = vmulps_avx512vl(_local_4c0,auVar96);
    auVar111 = vsubps_avx512vl(local_6a0,auVar111);
    uVar78 = vcmpps_avx512vl(auVar111,auVar115,5);
    bVar66 = (byte)uVar78;
    fVar138 = (float)local_6e0._0_4_;
    fVar167 = (float)local_6e0._4_4_;
    fVar169 = fStack_6d8;
    fVar171 = fStack_6d4;
    fVar152 = fStack_6d0;
    fVar173 = fStack_6cc;
    fVar175 = fStack_6c8;
    fVar205 = fStack_6c4;
    if (bVar66 == 0) {
LAB_01c6f6d5:
      auVar252 = ZEXT3264(local_720);
      auVar235 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar241 = ZEXT3264(local_7e0);
      auVar242 = ZEXT3264(local_800);
      auVar231 = ZEXT3264(local_560);
      auVar217 = ZEXT3264(local_700);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      auVar246 = ZEXT3264(local_820);
      auVar247 = ZEXT3264(local_960);
      auVar248 = ZEXT3264(local_840);
      auVar249 = ZEXT3264(local_980);
      auVar250 = ZEXT3264(local_860);
      auVar253 = ZEXT3264(local_9a0);
      auVar254 = ZEXT3264(local_9c0);
    }
    else {
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar113 = vaddps_avx512vl(auVar106,auVar106);
      local_540 = vrcp14ps_avx512vl(auVar113);
      auVar114 = vfnmadd213ps_avx512vl(local_540,auVar113,auVar114);
      auVar114 = vfmadd132ps_avx512vl(auVar114,local_540,local_540);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      local_6c0 = vxorps_avx512vl(auVar110,auVar36);
      auVar115 = vsubps_avx512vl(local_6c0,auVar111);
      local_4e0 = vmulps_avx512vl(auVar115,auVar114);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      local_780 = vmulps_avx512vl(auVar111,auVar114);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar111,local_4e0);
      auVar116._0_4_ =
           (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar111._0_4_;
      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar111._4_4_;
      bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar111._8_4_;
      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar111._12_4_;
      bVar9 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar111._16_4_;
      bVar9 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar111._20_4_;
      bVar9 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar111._24_4_;
      bVar9 = SUB81(uVar78 >> 7,0);
      auVar116._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar111,local_780);
      auVar117._0_4_ =
           (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar111._0_4_;
      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar111._4_4_;
      bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar111._8_4_;
      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar111._12_4_;
      bVar9 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar111._16_4_;
      bVar9 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar111._20_4_;
      bVar9 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar111._24_4_;
      bVar9 = SUB81(uVar78 >> 7,0);
      auVar117._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar104,auVar111);
      local_500 = vmaxps_avx512vl(local_240,auVar111);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar37);
      vandps_avx512vl(auVar106,auVar111);
      uVar69 = vcmpps_avx512vl(local_520,local_520,1);
      uVar78 = uVar78 & uVar69;
      bVar70 = (byte)uVar78;
      if (bVar70 != 0) {
        uVar69 = vcmpps_avx512vl(auVar96,_DAT_01faff00,2);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar96,auVar104);
        bVar73 = (byte)uVar69;
        uVar80 = (uint)(bVar73 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar73 & 1) * local_520._0_4_;
        bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
        uVar79 = (uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * local_520._4_4_;
        bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
        uVar131 = (uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * local_520._8_4_;
        bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
        uVar132 = (uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * local_520._12_4_;
        bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
        uVar133 = (uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * local_520._16_4_;
        bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
        uVar134 = (uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * local_520._20_4_;
        bVar9 = (bool)((byte)(uVar69 >> 6) & 1);
        uVar135 = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * local_520._24_4_;
        bVar9 = SUB81(uVar69 >> 7,0);
        uVar136 = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * local_520._28_4_;
        auVar116._0_4_ = (bVar70 & 1) * uVar80 | !(bool)(bVar70 & 1) * auVar116._0_4_;
        bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ = bVar9 * uVar79 | !bVar9 * auVar116._4_4_;
        bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ = bVar9 * uVar131 | !bVar9 * auVar116._8_4_;
        bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ = bVar9 * uVar132 | !bVar9 * auVar116._12_4_;
        bVar9 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar116._16_4_ = bVar9 * uVar133 | !bVar9 * auVar116._16_4_;
        bVar9 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar116._20_4_ = bVar9 * uVar134 | !bVar9 * auVar116._20_4_;
        bVar9 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar116._24_4_ = bVar9 * uVar135 | !bVar9 * auVar116._24_4_;
        bVar9 = SUB81(uVar78 >> 7,0);
        auVar116._28_4_ = bVar9 * uVar136 | !bVar9 * auVar116._28_4_;
        auVar96 = vblendmps_avx512vl(auVar104,auVar96);
        bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar16 = SUB81(uVar69 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar70 & 1) *
             ((uint)(bVar73 & 1) * auVar96._0_4_ | !(bool)(bVar73 & 1) * uVar80) |
             !(bool)(bVar70 & 1) * auVar117._0_4_;
        bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar10 * ((uint)bVar9 * auVar96._4_4_ | !bVar9 * uVar79) |
             !bVar10 * auVar117._4_4_;
        bVar9 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar9 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar131) |
             !bVar9 * auVar117._8_4_;
        bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar9 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar132) |
             !bVar9 * auVar117._12_4_;
        bVar9 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar9 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar133) |
             !bVar9 * auVar117._16_4_;
        bVar9 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar9 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar134) |
             !bVar9 * auVar117._20_4_;
        bVar9 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar9 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar135) |
             !bVar9 * auVar117._24_4_;
        bVar9 = SUB81(uVar78 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar9 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar136) |
             !bVar9 * auVar117._28_4_;
        bVar66 = (~bVar70 | bVar73) & bVar66;
      }
      if ((bVar66 & 0x7f) == 0) {
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar96);
        goto LAB_01c6f6d5;
      }
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = vxorps_avx512vl(auVar92,auVar96);
      auVar105 = vxorps_avx512vl(auVar105,auVar96);
      uVar80 = *(uint *)(ray + k * 4 + 0x80);
      auVar91 = vxorps_avx512vl(auVar91,auVar96);
      auVar83 = vsubss_avx512f(ZEXT416(uVar80),ZEXT416((uint)local_670._0_4_));
      auVar92 = vbroadcastss_avx512vl(auVar83);
      auVar92 = vminps_avx512vl(auVar92,auVar117);
      auVar64._4_4_ = fStack_25c;
      auVar64._0_4_ = local_260;
      auVar64._8_4_ = fStack_258;
      auVar64._12_4_ = fStack_254;
      auVar64._16_4_ = fStack_250;
      auVar64._20_4_ = fStack_24c;
      auVar64._24_4_ = fStack_248;
      auVar64._28_4_ = fStack_244;
      auVar106 = vmaxps_avx512vl(auVar64,auVar116);
      auVar109 = vmulps_avx512vl(auVar109,auVar49);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar240,auVar109);
      auVar83 = vfmadd213ps_fma(auVar107,auVar239,auVar108);
      auVar107 = vmulps_avx512vl(local_720,auVar49);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_3c0,auVar240);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_3a0,auVar239);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar108,auVar109,1);
      auVar111 = vxorps_avx512vl(ZEXT1632(auVar83),auVar96);
      auVar114 = vrcp14ps_avx512vl(auVar107);
      auVar115 = vxorps_avx512vl(auVar107,auVar96);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar119 = vfnmadd213ps_avx512vl(auVar114,auVar107,auVar118);
      auVar83 = vfmadd132ps_fma(auVar119,auVar114,auVar114);
      fVar153 = auVar83._0_4_ * auVar111._0_4_;
      fVar168 = auVar83._4_4_ * auVar111._4_4_;
      auVar52._4_4_ = fVar168;
      auVar52._0_4_ = fVar153;
      fVar170 = auVar83._8_4_ * auVar111._8_4_;
      auVar52._8_4_ = fVar170;
      fVar172 = auVar83._12_4_ * auVar111._12_4_;
      auVar52._12_4_ = fVar172;
      fVar174 = auVar111._16_4_ * 0.0;
      auVar52._16_4_ = fVar174;
      fVar176 = auVar111._20_4_ * 0.0;
      auVar52._20_4_ = fVar176;
      fVar177 = auVar111._24_4_ * 0.0;
      auVar52._24_4_ = fVar177;
      auVar52._28_4_ = auVar111._28_4_;
      uVar19 = vcmpps_avx512vl(auVar107,auVar115,1);
      bVar70 = (byte)uVar17 | (byte)uVar19;
      auVar233._8_4_ = 0xff800000;
      auVar233._0_8_ = 0xff800000ff800000;
      auVar233._12_4_ = 0xff800000;
      auVar233._16_4_ = 0xff800000;
      auVar233._20_4_ = 0xff800000;
      auVar233._24_4_ = 0xff800000;
      auVar233._28_4_ = 0xff800000;
      auVar119 = vblendmps_avx512vl(auVar52,auVar233);
      auVar120._0_4_ =
           (uint)(bVar70 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar114._0_4_;
      bVar9 = (bool)(bVar70 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar9 * auVar119._4_4_ | (uint)!bVar9 * auVar114._4_4_;
      bVar9 = (bool)(bVar70 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar9 * auVar119._8_4_ | (uint)!bVar9 * auVar114._8_4_;
      bVar9 = (bool)(bVar70 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar9 * auVar119._12_4_ | (uint)!bVar9 * auVar114._12_4_;
      bVar9 = (bool)(bVar70 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar9 * auVar119._16_4_ | (uint)!bVar9 * auVar114._16_4_;
      bVar9 = (bool)(bVar70 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar9 * auVar119._20_4_ | (uint)!bVar9 * auVar114._20_4_;
      bVar9 = (bool)(bVar70 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar9 * auVar119._24_4_ | (uint)!bVar9 * auVar114._24_4_;
      auVar120._28_4_ =
           (uint)(bVar70 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar114._28_4_;
      auVar114 = vmaxps_avx512vl(auVar106,auVar120);
      uVar19 = vcmpps_avx512vl(auVar107,auVar115,6);
      bVar70 = (byte)uVar17 | (byte)uVar19;
      auVar121._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar153;
      bVar9 = (bool)(bVar70 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar168;
      bVar9 = (bool)(bVar70 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar170;
      bVar9 = (bool)(bVar70 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar172;
      bVar9 = (bool)(bVar70 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar174;
      bVar9 = (bool)(bVar70 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar176;
      bVar9 = (bool)(bVar70 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar177;
      auVar121._28_4_ =
           (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar111._28_4_;
      auVar92 = vminps_avx512vl(auVar92,auVar121);
      auVar83 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar83),auVar101);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar83),auVar102);
      auVar106 = ZEXT1632(auVar83);
      auVar103 = vsubps_avx512vl(auVar106,auVar103);
      auVar103 = vmulps_avx512vl(auVar103,auVar104);
      auVar102 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar102);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar101);
      auVar102 = vmulps_avx512vl(local_720,auVar104);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3c0,auVar91);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3a0,auVar105);
      vandps_avx512vl(auVar102,auVar108);
      uVar17 = vcmpps_avx512vl(auVar102,auVar109,1);
      auVar101 = vxorps_avx512vl(auVar101,auVar96);
      auVar103 = vrcp14ps_avx512vl(auVar102);
      auVar96 = vxorps_avx512vl(auVar102,auVar96);
      auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar118);
      auVar83 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
      fVar153 = auVar83._0_4_ * auVar101._0_4_;
      fVar168 = auVar83._4_4_ * auVar101._4_4_;
      auVar53._4_4_ = fVar168;
      auVar53._0_4_ = fVar153;
      fVar170 = auVar83._8_4_ * auVar101._8_4_;
      auVar53._8_4_ = fVar170;
      fVar172 = auVar83._12_4_ * auVar101._12_4_;
      auVar53._12_4_ = fVar172;
      fVar174 = auVar101._16_4_ * 0.0;
      auVar53._16_4_ = fVar174;
      fVar176 = auVar101._20_4_ * 0.0;
      auVar53._20_4_ = fVar176;
      fVar177 = auVar101._24_4_ * 0.0;
      auVar53._24_4_ = fVar177;
      auVar53._28_4_ = auVar101._28_4_;
      uVar19 = vcmpps_avx512vl(auVar102,auVar96,1);
      bVar70 = (byte)uVar17 | (byte)uVar19;
      auVar104 = vblendmps_avx512vl(auVar53,auVar233);
      auVar122._0_4_ =
           (uint)(bVar70 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar103._0_4_;
      bVar9 = (bool)(bVar70 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar9 * auVar104._4_4_ | (uint)!bVar9 * auVar103._4_4_;
      bVar9 = (bool)(bVar70 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar9 * auVar104._8_4_ | (uint)!bVar9 * auVar103._8_4_;
      bVar9 = (bool)(bVar70 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar9 * auVar104._12_4_ | (uint)!bVar9 * auVar103._12_4_;
      bVar9 = (bool)(bVar70 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar9 * auVar104._16_4_ | (uint)!bVar9 * auVar103._16_4_;
      bVar9 = (bool)(bVar70 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar9 * auVar104._20_4_ | (uint)!bVar9 * auVar103._20_4_;
      bVar9 = (bool)(bVar70 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar9 * auVar104._24_4_ | (uint)!bVar9 * auVar103._24_4_;
      auVar122._28_4_ =
           (uint)(bVar70 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar103._28_4_;
      _local_600 = vmaxps_avx(auVar114,auVar122);
      uVar19 = vcmpps_avx512vl(auVar102,auVar96,6);
      bVar70 = (byte)uVar17 | (byte)uVar19;
      auVar123._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar153;
      bVar9 = (bool)(bVar70 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar168;
      bVar9 = (bool)(bVar70 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar170;
      bVar9 = (bool)(bVar70 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar172;
      bVar9 = (bool)(bVar70 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar174;
      bVar9 = (bool)(bVar70 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar176;
      bVar9 = (bool)(bVar70 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar177;
      auVar123._28_4_ =
           (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar101._28_4_;
      local_2e0 = vminps_avx(auVar92,auVar123);
      uVar17 = vcmpps_avx512vl(_local_600,local_2e0,2);
      bVar66 = bVar66 & 0x7f & (byte)uVar17;
      if (bVar66 == 0) {
        auVar255 = ZEXT3264(auVar118);
        goto LAB_01c6f6d5;
      }
      auVar101 = vmaxps_avx512vl(auVar106,local_7a0);
      auVar96 = vfmadd213ps_avx512vl(local_4e0,auVar112,auVar93);
      fVar153 = auVar94._0_4_;
      fVar168 = auVar94._4_4_;
      auVar54._4_4_ = fVar168 * auVar96._4_4_;
      auVar54._0_4_ = fVar153 * auVar96._0_4_;
      fVar170 = auVar94._8_4_;
      auVar54._8_4_ = fVar170 * auVar96._8_4_;
      fVar172 = auVar94._12_4_;
      auVar54._12_4_ = fVar172 * auVar96._12_4_;
      fVar174 = auVar94._16_4_;
      auVar54._16_4_ = fVar174 * auVar96._16_4_;
      fVar176 = auVar94._20_4_;
      auVar54._20_4_ = fVar176 * auVar96._20_4_;
      fVar177 = auVar94._24_4_;
      auVar54._24_4_ = fVar177 * auVar96._24_4_;
      auVar54._28_4_ = auVar96._28_4_;
      auVar96 = vfmadd213ps_avx512vl(local_780,auVar112,auVar93);
      auVar55._4_4_ = fVar168 * auVar96._4_4_;
      auVar55._0_4_ = fVar153 * auVar96._0_4_;
      auVar55._8_4_ = fVar170 * auVar96._8_4_;
      auVar55._12_4_ = fVar172 * auVar96._12_4_;
      auVar55._16_4_ = fVar174 * auVar96._16_4_;
      auVar55._20_4_ = fVar176 * auVar96._20_4_;
      auVar55._24_4_ = fVar177 * auVar96._24_4_;
      auVar55._28_4_ = auVar122._28_4_;
      auVar96 = vminps_avx512vl(auVar54,auVar118);
      auVar61 = ZEXT812(0);
      auVar102 = ZEXT1232(auVar61) << 0x20;
      auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar61) << 0x20);
      auVar103 = vminps_avx512vl(auVar55,auVar118);
      auVar56._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar96._28_4_ + 7.0;
      auVar83 = vfmadd213ps_fma(auVar56,local_760,auVar209);
      local_1a0 = ZEXT1632(auVar83);
      auVar96 = vmaxps_avx(auVar103,ZEXT1232(auVar61) << 0x20);
      auVar57._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar96._28_4_ + 7.0;
      auVar83 = vfmadd213ps_fma(auVar57,local_760,auVar209);
      local_1c0 = ZEXT1632(auVar83);
      auVar58._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar58._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar58._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar58._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar58._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar58._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar58._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar58._28_4_ = auVar101._28_4_;
      auVar96 = vsubps_avx(local_7c0,auVar58);
      auVar59._4_4_ = auVar96._4_4_ * (float)local_4c0._4_4_;
      auVar59._0_4_ = auVar96._0_4_ * (float)local_4c0._0_4_;
      auVar59._8_4_ = auVar96._8_4_ * fStack_4b8;
      auVar59._12_4_ = auVar96._12_4_ * fStack_4b4;
      auVar59._16_4_ = auVar96._16_4_ * fStack_4b0;
      auVar59._20_4_ = auVar96._20_4_ * fStack_4ac;
      auVar59._24_4_ = auVar96._24_4_ * fStack_4a8;
      auVar59._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(local_6a0,auVar59);
      uVar78 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar61) << 0x20,5);
      auVar250 = ZEXT3264(local_860);
      if ((byte)uVar78 == 0) {
        uVar78 = 0;
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar124._8_4_ = 0x7f800000;
        auVar124._0_8_ = 0x7f8000007f800000;
        auVar124._12_4_ = 0x7f800000;
        auVar124._16_4_ = 0x7f800000;
        auVar124._20_4_ = 0x7f800000;
        auVar124._24_4_ = 0x7f800000;
        auVar124._28_4_ = 0x7f800000;
        auVar125._8_4_ = 0xff800000;
        auVar125._0_8_ = 0xff800000ff800000;
        auVar125._12_4_ = 0xff800000;
        auVar125._16_4_ = 0xff800000;
        auVar125._20_4_ = 0xff800000;
        auVar125._24_4_ = 0xff800000;
        auVar125._28_4_ = 0xff800000;
      }
      else {
        uVar69 = vcmpps_avx512vl(auVar101,auVar106,5);
        auVar101 = vsqrtps_avx(auVar101);
        auVar102 = vfnmadd213ps_avx512vl(auVar113,local_540,auVar118);
        auVar104 = vfmadd132ps_avx512vl(auVar102,local_540,local_540);
        auVar102 = vsubps_avx(local_6c0,auVar101);
        auVar105 = vmulps_avx512vl(auVar102,auVar104);
        auVar101 = vsubps_avx512vl(auVar101,auVar110);
        auVar91 = vmulps_avx512vl(auVar101,auVar104);
        auVar101 = vfmadd213ps_avx512vl(auVar112,auVar105,auVar93);
        auVar60._4_4_ = fVar168 * auVar101._4_4_;
        auVar60._0_4_ = fVar153 * auVar101._0_4_;
        auVar60._8_4_ = fVar170 * auVar101._8_4_;
        auVar60._12_4_ = fVar172 * auVar101._12_4_;
        auVar60._16_4_ = fVar174 * auVar101._16_4_;
        auVar60._20_4_ = fVar176 * auVar101._20_4_;
        auVar60._24_4_ = fVar177 * auVar101._24_4_;
        auVar60._28_4_ = auVar103._28_4_;
        auVar101 = vmulps_avx512vl(local_3a0,auVar105);
        auVar102 = vmulps_avx512vl(local_3c0,auVar105);
        auVar92 = vmulps_avx512vl(local_720,auVar105);
        auVar103 = vfmadd213ps_avx512vl(auVar97,auVar60,auVar216);
        auVar103 = vsubps_avx512vl(auVar101,auVar103);
        auVar101 = vfmadd213ps_avx512vl(auVar98,auVar60,auVar95);
        auVar104 = vsubps_avx512vl(auVar102,auVar101);
        auVar83 = vfmadd213ps_fma(auVar60,auVar99,auVar100);
        auVar101 = vsubps_avx(auVar92,ZEXT1632(auVar83));
        auVar102 = vfmadd213ps_avx512vl(auVar112,auVar91,auVar93);
        auVar93 = vmulps_avx512vl(auVar94,auVar102);
        auVar94 = vmulps_avx512vl(local_3a0,auVar91);
        auVar92 = vmulps_avx512vl(local_3c0,auVar91);
        auVar106 = vmulps_avx512vl(local_720,auVar91);
        auVar83 = vfmadd213ps_fma(auVar97,auVar93,auVar216);
        auVar102 = vsubps_avx(auVar94,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar98,auVar93,auVar95);
        auVar94 = vsubps_avx512vl(auVar92,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar99,auVar93,auVar100);
        auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar83));
        auVar199._8_4_ = 0x7f800000;
        auVar199._0_8_ = 0x7f8000007f800000;
        auVar199._12_4_ = 0x7f800000;
        auVar199._16_4_ = 0x7f800000;
        auVar199._20_4_ = 0x7f800000;
        auVar199._24_4_ = 0x7f800000;
        auVar199._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar199,auVar105);
        bVar9 = (bool)((byte)uVar69 & 1);
        auVar124._0_4_ = (uint)bVar9 * auVar98._0_4_ | (uint)!bVar9 * auVar87._0_4_;
        bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar9 * auVar98._4_4_ | (uint)!bVar9 * auVar87._4_4_;
        bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar9 * auVar98._8_4_ | (uint)!bVar9 * auVar87._8_4_;
        bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar9 * auVar98._12_4_ | (uint)!bVar9 * auVar87._12_4_;
        iVar1 = (uint)((byte)(uVar69 >> 4) & 1) * auVar98._16_4_;
        auVar124._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar69 >> 5) & 1) * auVar98._20_4_;
        auVar124._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar69 >> 6) & 1) * auVar98._24_4_;
        auVar124._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar69 >> 7) * auVar98._28_4_;
        auVar124._28_4_ = iVar4;
        auVar200._8_4_ = 0xff800000;
        auVar200._0_8_ = 0xff800000ff800000;
        auVar200._12_4_ = 0xff800000;
        auVar200._16_4_ = 0xff800000;
        auVar200._20_4_ = 0xff800000;
        auVar200._24_4_ = 0xff800000;
        auVar200._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar200,auVar91);
        bVar9 = (bool)((byte)uVar69 & 1);
        auVar125._0_4_ = (uint)bVar9 * auVar98._0_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar9 * auVar98._4_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar9 * auVar98._8_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar9 * auVar98._12_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar9 * auVar98._16_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar9 * auVar98._20_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar9 * auVar98._24_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = SUB81(uVar69 >> 7,0);
        auVar125._28_4_ = (uint)bVar9 * auVar98._28_4_ | (uint)!bVar9 * -0x800000;
        auVar38._8_4_ = 0x36000000;
        auVar38._0_8_ = 0x3600000036000000;
        auVar38._12_4_ = 0x36000000;
        auVar38._16_4_ = 0x36000000;
        auVar38._20_4_ = 0x36000000;
        auVar38._24_4_ = 0x36000000;
        auVar38._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(local_500,auVar38);
        uVar18 = vcmpps_avx512vl(auVar98,local_520,0xe);
        uVar69 = uVar69 & uVar18;
        bVar70 = (byte)uVar69;
        if (bVar70 != 0) {
          uVar18 = vcmpps_avx512vl(auVar96,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar234._8_4_ = 0xff800000;
          auVar234._0_8_ = 0xff800000ff800000;
          auVar234._12_4_ = 0xff800000;
          auVar234._16_4_ = 0xff800000;
          auVar234._20_4_ = 0xff800000;
          auVar234._24_4_ = 0xff800000;
          auVar234._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar232,auVar234);
          bVar73 = (byte)uVar18;
          uVar79 = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar98._0_4_;
          bVar9 = (bool)((byte)(uVar18 >> 1) & 1);
          uVar131 = (uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * auVar98._4_4_;
          bVar9 = (bool)((byte)(uVar18 >> 2) & 1);
          uVar132 = (uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * auVar98._8_4_;
          bVar9 = (bool)((byte)(uVar18 >> 3) & 1);
          uVar133 = (uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * auVar98._12_4_;
          bVar9 = (bool)((byte)(uVar18 >> 4) & 1);
          uVar134 = (uint)bVar9 * auVar96._16_4_ | (uint)!bVar9 * auVar98._16_4_;
          bVar9 = (bool)((byte)(uVar18 >> 5) & 1);
          uVar135 = (uint)bVar9 * auVar96._20_4_ | (uint)!bVar9 * auVar98._20_4_;
          bVar9 = (bool)((byte)(uVar18 >> 6) & 1);
          uVar136 = (uint)bVar9 * auVar96._24_4_ | (uint)!bVar9 * auVar98._24_4_;
          bVar9 = SUB81(uVar18 >> 7,0);
          uVar137 = (uint)bVar9 * auVar96._28_4_ | (uint)!bVar9 * auVar98._28_4_;
          auVar124._0_4_ = (bVar70 & 1) * uVar79 | !(bool)(bVar70 & 1) * auVar124._0_4_;
          bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = bVar9 * uVar131 | !bVar9 * auVar124._4_4_;
          bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = bVar9 * uVar132 | !bVar9 * auVar124._8_4_;
          bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = bVar9 * uVar133 | !bVar9 * auVar124._12_4_;
          bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar124._16_4_ = bVar9 * uVar134 | (uint)!bVar9 * iVar1;
          bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar124._20_4_ = bVar9 * uVar135 | (uint)!bVar9 * iVar2;
          bVar9 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar124._24_4_ = bVar9 * uVar136 | (uint)!bVar9 * iVar3;
          bVar9 = SUB81(uVar69 >> 7,0);
          auVar124._28_4_ = bVar9 * uVar137 | (uint)!bVar9 * iVar4;
          auVar96 = vblendmps_avx512vl(auVar234,auVar232);
          bVar9 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
          bVar16 = SUB81(uVar18 >> 7,0);
          auVar125._0_4_ =
               (uint)(bVar70 & 1) *
               ((uint)(bVar73 & 1) * auVar96._0_4_ | !(bool)(bVar73 & 1) * uVar79) |
               !(bool)(bVar70 & 1) * auVar125._0_4_;
          bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ =
               (uint)bVar10 * ((uint)bVar9 * auVar96._4_4_ | !bVar9 * uVar131) |
               !bVar10 * auVar125._4_4_;
          bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ =
               (uint)bVar9 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar132) |
               !bVar9 * auVar125._8_4_;
          bVar9 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ =
               (uint)bVar9 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar133) |
               !bVar9 * auVar125._12_4_;
          bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar125._16_4_ =
               (uint)bVar9 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar134) |
               !bVar9 * auVar125._16_4_;
          bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar125._20_4_ =
               (uint)bVar9 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar135) |
               !bVar9 * auVar125._20_4_;
          bVar9 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar125._24_4_ =
               (uint)bVar9 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar136) |
               !bVar9 * auVar125._24_4_;
          bVar9 = SUB81(uVar69 >> 7,0);
          auVar125._28_4_ =
               (uint)bVar9 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar137) |
               !bVar9 * auVar125._28_4_;
          uVar78 = (ulong)(byte)((~bVar70 | bVar73) & (byte)uVar78);
        }
      }
      auVar256 = ZEXT3264(local_8e0);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      auVar247 = ZEXT3264(local_960);
      auVar249 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9a0);
      auVar254 = ZEXT3264(local_9c0);
      auVar252 = ZEXT3264(local_720);
      auVar96 = vmulps_avx512vl(local_720,auVar97);
      auVar83 = vfmadd231ps_fma(auVar96,local_3c0,auVar94);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_3a0,auVar102);
      _local_200 = _local_600;
      local_1e0 = vminps_avx(local_2e0,auVar124);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(ZEXT1632(auVar83),auVar230);
      auVar94 = vmaxps_avx(_local_600,auVar125);
      local_300 = auVar94;
      auVar202._8_4_ = 0x3e99999a;
      auVar202._0_8_ = 0x3e99999a3e99999a;
      auVar202._12_4_ = 0x3e99999a;
      auVar202._16_4_ = 0x3e99999a;
      auVar202._20_4_ = 0x3e99999a;
      auVar202._24_4_ = 0x3e99999a;
      auVar202._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar96,auVar202,1);
      local_380._0_2_ = (short)uVar17;
      uVar17 = vcmpps_avx512vl(_local_600,local_1e0,2);
      bVar70 = (byte)uVar17 & bVar66;
      uVar19 = vcmpps_avx512vl(auVar94,local_2e0,2);
      auVar241 = ZEXT3264(local_7e0);
      auVar242 = ZEXT3264(local_800);
      auVar246 = ZEXT3264(local_820);
      auVar248 = ZEXT3264(local_840);
      if ((bVar66 & ((byte)uVar19 | (byte)uVar17)) == 0) {
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar96);
        auVar235 = ZEXT3264(local_8c0);
        auVar231 = ZEXT3264(local_560);
        auVar217 = ZEXT3264(local_700);
      }
      else {
        uVar69 = CONCAT71((int7)(uVar78 >> 8),~(byte)uVar78);
        auVar96 = vmulps_avx512vl(local_720,auVar101);
        auVar83 = vfmadd213ps_fma(auVar104,local_3c0,auVar96);
        auVar83 = vfmadd213ps_fma(auVar103,local_3a0,ZEXT1632(auVar83));
        auVar96 = vandps_avx(ZEXT1632(auVar83),auVar230);
        uVar17 = vcmpps_avx512vl(auVar96,auVar202,1);
        bVar73 = (byte)uVar17 | ~(byte)uVar78;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar148,auVar39);
        local_2a0._0_4_ = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar9 = (bool)(bVar73 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar9 * auVar96._16_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar9 * auVar96._20_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar9 * auVar96._24_4_ | (uint)!bVar9 * 2;
        local_2a0._28_4_ = (uint)(bVar73 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_320,local_2a0,5);
        bVar73 = (byte)uVar17 & bVar70;
        auVar235 = ZEXT3264(local_8c0);
        if (bVar73 == 0) {
          auVar150._4_4_ = uVar80;
          auVar150._0_4_ = uVar80;
          auVar150._8_4_ = uVar80;
          auVar150._12_4_ = uVar80;
          auVar150._16_4_ = uVar80;
          auVar150._20_4_ = uVar80;
          auVar150._24_4_ = uVar80;
          auVar150._28_4_ = uVar80;
        }
        else {
          local_2c0 = auVar94;
          local_9d0 = (uint)uVar69;
          auVar86 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar84 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar85 = vminps_avx(auVar86,auVar84);
          auVar86 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vmaxps_avx(auVar83,auVar86);
          auVar178._8_4_ = 0x7fffffff;
          auVar178._0_8_ = 0x7fffffff7fffffff;
          auVar178._12_4_ = 0x7fffffff;
          auVar83 = vandps_avx(auVar85,auVar178);
          auVar86 = vandps_avx(auVar84,auVar178);
          auVar83 = vmaxps_avx(auVar83,auVar86);
          auVar86 = vmovshdup_avx(auVar83);
          auVar86 = vmaxss_avx(auVar86,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar86);
          fVar138 = auVar83._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar84,auVar84,0xff);
          local_360 = (float)local_6e0._0_4_ + (float)local_600._0_4_;
          fStack_35c = (float)local_6e0._4_4_ + (float)local_600._4_4_;
          fStack_358 = fStack_6d8 + fStack_5f8;
          fStack_354 = fStack_6d4 + fStack_5f4;
          fStack_350 = fStack_6d0 + fStack_5f0;
          fStack_34c = fStack_6cc + fStack_5ec;
          fStack_348 = fStack_6c8 + fStack_5e8;
          fStack_344 = fStack_6c4 + fStack_5e4;
          do {
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar149,_local_600);
            auVar127._0_4_ =
                 (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar9 * auVar96._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar9 * auVar96._20_4_ | (uint)!bVar9 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar73 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar96 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar96 = vminps_avx(auVar127,auVar96);
            auVar94 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar94);
            auVar94 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar94);
            uVar17 = vcmpps_avx512vl(auVar127,auVar96,0);
            bVar67 = (byte)uVar17 & bVar73;
            bVar77 = bVar73;
            if (bVar67 != 0) {
              bVar77 = bVar67;
            }
            iVar2 = 0;
            for (uVar80 = (uint)bVar77; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar217 = ZEXT464(*(uint *)(local_1a0 + (uint)(iVar2 << 2)));
            fVar169 = local_9c8;
            fVar167 = *(float *)(local_200 + (uint)(iVar2 << 2));
            uVar139 = 0;
            uVar236 = 0;
            uVar237 = 0;
            if ((float)local_740._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar2 << 2)));
              local_7c0._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar2 << 2)));
              fVar169 = sqrtf((float)local_740._0_4_);
              auVar217 = ZEXT1664(local_7a0._0_16_);
              fVar167 = (float)local_7c0._0_4_;
              uVar139 = local_7c0._4_4_;
              uVar236 = local_7c0._8_4_;
              uVar237 = local_7c0._12_4_;
            }
            lVar74 = 5;
            do {
              auVar96 = local_7c0;
              auVar140._4_4_ = fVar167;
              auVar140._0_4_ = fVar167;
              auVar140._8_4_ = fVar167;
              auVar140._12_4_ = fVar167;
              auVar86 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_730);
              fVar152 = auVar217._0_4_;
              fVar171 = 1.0 - fVar152;
              auVar179._0_4_ = local_5c0._0_4_ * fVar152;
              auVar179._4_4_ = local_5c0._4_4_ * fVar152;
              auVar179._8_4_ = local_5c0._8_4_ * fVar152;
              auVar179._12_4_ = local_5c0._12_4_ * fVar152;
              local_4e0._0_16_ = ZEXT416((uint)fVar171);
              auVar207._4_4_ = fVar171;
              auVar207._0_4_ = fVar171;
              auVar207._8_4_ = fVar171;
              auVar207._12_4_ = fVar171;
              auVar83 = vfmadd231ps_fma(auVar179,auVar207,local_580._0_16_);
              auVar210._0_4_ = local_5a0._0_4_ * fVar152;
              auVar210._4_4_ = local_5a0._4_4_ * fVar152;
              auVar210._8_4_ = local_5a0._8_4_ * fVar152;
              auVar210._12_4_ = local_5a0._12_4_ * fVar152;
              auVar84 = vfmadd231ps_fma(auVar210,auVar207,local_5c0._0_16_);
              auVar218._0_4_ = fVar152 * (float)local_5e0._0_4_;
              auVar218._4_4_ = fVar152 * (float)local_5e0._4_4_;
              auVar218._8_4_ = fVar152 * fStack_5d8;
              auVar218._12_4_ = fVar152 * fStack_5d4;
              auVar85 = vfmadd231ps_fma(auVar218,auVar207,local_5a0._0_16_);
              auVar225._0_4_ = fVar152 * auVar84._0_4_;
              auVar225._4_4_ = fVar152 * auVar84._4_4_;
              auVar225._8_4_ = fVar152 * auVar84._8_4_;
              auVar225._12_4_ = fVar152 * auVar84._12_4_;
              auVar83 = vfmadd231ps_fma(auVar225,auVar207,auVar83);
              auVar180._0_4_ = fVar152 * auVar85._0_4_;
              auVar180._4_4_ = fVar152 * auVar85._4_4_;
              auVar180._8_4_ = fVar152 * auVar85._8_4_;
              auVar180._12_4_ = fVar152 * auVar85._12_4_;
              auVar84 = vfmadd231ps_fma(auVar180,auVar207,auVar84);
              auVar211._0_4_ = fVar152 * auVar84._0_4_;
              auVar211._4_4_ = fVar152 * auVar84._4_4_;
              auVar211._8_4_ = fVar152 * auVar84._8_4_;
              auVar211._12_4_ = fVar152 * auVar84._12_4_;
              auVar85 = vfmadd231ps_fma(auVar211,auVar83,auVar207);
              auVar83 = vsubps_avx(auVar84,auVar83);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar84 = vmulps_avx512vl(auVar83,auVar21);
              _local_4c0 = auVar85;
              auVar83 = vsubps_avx(auVar86,auVar85);
              local_760._0_16_ = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              local_6a0._0_16_ = auVar83;
              local_7a0._0_16_ = auVar217._0_16_;
              local_7c0._4_4_ = uVar139;
              local_7c0._0_4_ = fVar167;
              local_7c0._8_4_ = uVar236;
              local_7c0._16_16_ = auVar96._16_16_;
              local_7c0._12_4_ = uVar237;
              if (auVar83._0_4_ < 0.0) {
                auVar217._0_4_ = sqrtf(auVar83._0_4_);
                auVar217._4_60_ = extraout_var;
                auVar83 = auVar217._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_500._0_16_ = vdpps_avx(auVar84,auVar84,0x7f);
              fVar167 = local_500._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar167;
              local_780._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              fVar171 = local_780._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(local_500._0_16_,auVar22);
              auVar86 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar86._0_4_;
              local_6c0._0_4_ = auVar83._0_4_;
              if (fVar167 < auVar85._0_4_) {
                auVar231._0_4_ = sqrtf(fVar167);
                auVar231._4_60_ = extraout_var_00;
                auVar83 = ZEXT416((uint)local_6c0._0_4_);
                auVar86 = auVar231._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar152 = local_780._0_4_;
              fVar167 = fVar171 * 1.5 + fVar167 * -0.5 * fVar152 * fVar152 * fVar152;
              auVar141._0_4_ = auVar84._0_4_ * fVar167;
              auVar141._4_4_ = auVar84._4_4_ * fVar167;
              auVar141._8_4_ = auVar84._8_4_ * fVar167;
              auVar141._12_4_ = auVar84._12_4_ * fVar167;
              local_780._0_16_ = vdpps_avx(local_760._0_16_,auVar141,0x7f);
              auVar87 = vaddss_avx512f(auVar83,ZEXT416(0x3f800000));
              auVar142._0_4_ = local_780._0_4_ * local_780._0_4_;
              auVar142._4_4_ = local_780._4_4_ * local_780._4_4_;
              auVar142._8_4_ = local_780._8_4_ * local_780._8_4_;
              auVar142._12_4_ = local_780._12_4_ * local_780._12_4_;
              auVar85 = vsubps_avx(local_6a0._0_16_,auVar142);
              fVar171 = auVar85._0_4_;
              auVar155._4_12_ = ZEXT812(0) << 0x20;
              auVar155._0_4_ = fVar171;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar155);
              auVar88 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              auVar82 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar76 = fVar171 == 0.0;
              uVar75 = fVar171 < 0.0;
              if ((bool)uVar75) {
                local_630._0_4_ = auVar88._0_4_;
                local_650 = fVar167;
                fStack_64c = fVar167;
                fStack_648 = fVar167;
                fStack_644 = fVar167;
                local_640 = auVar81;
                fVar171 = sqrtf(fVar171);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar88 = ZEXT416((uint)local_630._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar83 = ZEXT416((uint)local_6c0._0_4_);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar81 = local_640;
                fVar167 = local_650;
                fVar152 = fStack_64c;
                fVar173 = fStack_648;
                fVar175 = fStack_644;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar171 = auVar85._0_4_;
                fVar152 = fVar167;
                fVar173 = fVar167;
                fVar175 = fVar167;
              }
              auVar235 = ZEXT3264(local_8c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar241 = ZEXT3264(local_7e0);
              auVar242 = ZEXT3264(local_800);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_820);
              auVar247 = ZEXT3264(local_960);
              auVar248 = ZEXT3264(local_840);
              auVar249 = ZEXT3264(local_980);
              auVar250 = ZEXT3264(local_860);
              auVar253 = ZEXT3264(local_9a0);
              auVar254 = ZEXT3264(local_9c0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                        local_4e0._0_16_);
              fVar205 = auVar85._0_4_ * 6.0;
              fVar153 = local_7a0._0_4_ * 6.0;
              auVar182._0_4_ = fVar153 * (float)local_5e0._0_4_;
              auVar182._4_4_ = fVar153 * (float)local_5e0._4_4_;
              auVar182._8_4_ = fVar153 * fStack_5d8;
              auVar182._12_4_ = fVar153 * fStack_5d4;
              auVar156._4_4_ = fVar205;
              auVar156._0_4_ = fVar205;
              auVar156._8_4_ = fVar205;
              auVar156._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar156,auVar182,local_5a0._0_16_);
              auVar251 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_7a0._0_16_);
              fVar205 = auVar251._0_4_ * 6.0;
              auVar183._4_4_ = fVar205;
              auVar183._0_4_ = fVar205;
              auVar183._8_4_ = fVar205;
              auVar183._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar183,auVar85,local_5c0._0_16_);
              fVar205 = local_4e0._0_4_ * 6.0;
              auVar157._4_4_ = fVar205;
              auVar157._0_4_ = fVar205;
              auVar157._8_4_ = fVar205;
              auVar157._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar157,auVar85,local_580._0_16_);
              auVar184._0_4_ = auVar85._0_4_ * (float)local_500._0_4_;
              auVar184._4_4_ = auVar85._4_4_ * (float)local_500._0_4_;
              auVar184._8_4_ = auVar85._8_4_ * (float)local_500._0_4_;
              auVar184._12_4_ = auVar85._12_4_ * (float)local_500._0_4_;
              auVar85 = vdpps_avx(auVar84,auVar85,0x7f);
              fVar205 = auVar85._0_4_;
              auVar158._0_4_ = auVar84._0_4_ * fVar205;
              auVar158._4_4_ = auVar84._4_4_ * fVar205;
              auVar158._8_4_ = auVar84._8_4_ * fVar205;
              auVar158._12_4_ = auVar84._12_4_ * fVar205;
              auVar85 = vsubps_avx(auVar184,auVar158);
              fVar205 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(auVar84,auVar23);
              auVar212._0_4_ = fVar167 * auVar85._0_4_ * fVar205;
              auVar212._4_4_ = fVar152 * auVar85._4_4_ * fVar205;
              auVar212._8_4_ = fVar173 * auVar85._8_4_ * fVar205;
              auVar212._12_4_ = fVar175 * auVar85._12_4_ * fVar205;
              auVar85 = vdpps_avx(auVar89,auVar141,0x7f);
              auVar251 = vmaxss_avx(ZEXT416((uint)fVar138),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * fVar169 * 1.9073486e-06)
                                           ));
              auVar90 = vdivss_avx512f(ZEXT416((uint)fVar138),auVar86);
              auVar86 = vdpps_avx(local_760._0_16_,auVar212,0x7f);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar138),auVar251);
              vfmadd213ss_avx512f(auVar87,auVar90,auVar83);
              auVar83 = vdpps_avx(local_730,auVar141,0x7f);
              fVar167 = auVar85._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_760._0_16_,auVar89,0x7f);
              auVar87 = vmulss_avx512f(auVar82,auVar81);
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              auVar85 = vdpps_avx(local_760._0_16_,local_730,0x7f);
              auVar81 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar87._0_4_ * auVar81._0_4_)));
              auVar87 = vfnmadd231ss_avx512f(auVar86,local_780._0_16_,ZEXT416((uint)fVar167));
              auVar88 = vfnmadd231ss_avx512f(auVar85,local_780._0_16_,auVar83);
              auVar86 = vpermilps_avx(_local_4c0,0xff);
              fVar171 = fVar171 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar84,auVar84,0xff);
              auVar85 = vfmsub213ss_fma(auVar87,auVar81,auVar86);
              fVar152 = auVar88._0_4_ * auVar81._0_4_;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar167),ZEXT416((uint)fVar152));
              fVar173 = auVar81._0_4_;
              auVar226._0_4_ = fVar152 / fVar173;
              auVar226._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar219._0_4_ = auVar85._0_4_ / fVar173;
              auVar219._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(local_780._0_16_,auVar226);
              auVar81 = vmulss_avx512f(local_780._0_16_,auVar219);
              fVar152 = local_7a0._0_4_ - (auVar85._0_4_ - fVar171 * (auVar83._0_4_ / fVar173));
              auVar217 = ZEXT464((uint)fVar152);
              fVar167 = (float)local_7c0._0_4_ - (fVar171 * (fVar167 / fVar173) - auVar81._0_4_);
              uVar139 = 0;
              uVar236 = 0;
              uVar237 = 0;
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(local_780._0_16_,auVar24);
              auVar83 = vucomiss_avx512f(auVar83);
              if (!(bool)uVar75 && !(bool)uVar76) {
                auVar83 = vaddss_avx512f(auVar251,auVar83);
                auVar83 = vfmadd231ss_fma(auVar83,local_660,ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar25);
                if (auVar85._0_4_ < auVar83._0_4_) {
                  fVar167 = fVar167 + (float)local_670._0_4_;
                  if ((((fVar167 < fVar206) ||
                       (fVar169 = *(float *)(ray + k * 4 + 0x80), fVar169 < fVar167)) ||
                      (fVar152 < 0.0)) || (1.0 < fVar152)) break;
                  auVar185._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar185._0_4_ = local_6a0._0_4_;
                  auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar185);
                  fVar171 = auVar83._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar72].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar171 = fVar171 * 1.5 +
                            (float)local_6a0._0_4_ * -0.5 * fVar171 * fVar171 * fVar171;
                  auVar186._0_4_ = local_760._0_4_ * fVar171;
                  auVar186._4_4_ = local_760._4_4_ * fVar171;
                  auVar186._8_4_ = local_760._8_4_ * fVar171;
                  auVar186._12_4_ = local_760._12_4_ * fVar171;
                  auVar85 = vfmadd213ps_fma(auVar86,auVar186,auVar84);
                  auVar83 = vshufps_avx(auVar186,auVar186,0xc9);
                  auVar86 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar187._0_4_ = auVar186._0_4_ * auVar86._0_4_;
                  auVar187._4_4_ = auVar186._4_4_ * auVar86._4_4_;
                  auVar187._8_4_ = auVar186._8_4_ * auVar86._8_4_;
                  auVar187._12_4_ = auVar186._12_4_ * auVar86._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar187,auVar84,auVar83);
                  auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar86 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar143._0_4_ = auVar85._0_4_ * auVar84._0_4_;
                  auVar143._4_4_ = auVar85._4_4_ * auVar84._4_4_;
                  auVar143._8_4_ = auVar85._8_4_ * auVar84._8_4_;
                  auVar143._12_4_ = auVar85._12_4_ * auVar84._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar143,auVar83,auVar86);
                  uVar139 = auVar83._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar167;
                    uVar236 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar236;
                    uVar236 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar236;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar139;
                    *(float *)(ray + k * 4 + 0xf0) = fVar152;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                    *(uint *)(ray + k * 4 + 0x120) = uVar72;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                  auStack_450 = vshufps_avx(auVar83,auVar83,0xaa);
                  local_440 = uVar139;
                  uStack_43c = uVar139;
                  uStack_438 = uVar139;
                  uStack_434 = uVar139;
                  local_430 = fVar152;
                  fStack_42c = fVar152;
                  fStack_428 = fVar152;
                  fStack_424 = fVar152;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar167;
                  local_9e0 = local_490;
                  local_890.valid = (int *)local_9e0;
                  local_890.geometryUserPtr = pGVar7->userPtr;
                  local_890.context = context->user;
                  local_890.hit = local_460;
                  local_890.N = 4;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_890);
                    auVar254 = ZEXT3264(local_9c0);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar250 = ZEXT3264(local_860);
                    auVar249 = ZEXT3264(local_980);
                    auVar248 = ZEXT3264(local_840);
                    auVar247 = ZEXT3264(local_960);
                    auVar246 = ZEXT3264(local_820);
                    auVar245 = ZEXT3264(local_940);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar242 = ZEXT3264(local_800);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar256 = ZEXT3264(local_8e0);
                    auVar235 = ZEXT3264(local_8c0);
                  }
                  uVar78 = vptestmd_avx512vl(local_9e0,local_9e0);
                  if ((uVar78 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_890);
                      auVar254 = ZEXT3264(local_9c0);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar250 = ZEXT3264(local_860);
                      auVar249 = ZEXT3264(local_980);
                      auVar248 = ZEXT3264(local_840);
                      auVar247 = ZEXT3264(local_960);
                      auVar246 = ZEXT3264(local_820);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar242 = ZEXT3264(local_800);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar235 = ZEXT3264(local_8c0);
                    }
                    uVar78 = vptestmd_avx512vl(local_9e0,local_9e0);
                    uVar78 = uVar78 & 0xf;
                    bVar77 = (byte)uVar78;
                    if (bVar77 != 0) {
                      iVar3 = *(int *)(local_890.hit + 4);
                      iVar4 = *(int *)(local_890.hit + 8);
                      iVar1 = *(int *)(local_890.hit + 0xc);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xc0) =
                           (uint)(bVar77 & 1) * *(int *)local_890.hit |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xc0);
                      *(uint *)(local_890.ray + 0xc4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xc4);
                      *(uint *)(local_890.ray + 200) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 200);
                      *(uint *)(local_890.ray + 0xcc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xcc);
                      iVar3 = *(int *)(local_890.hit + 0x14);
                      iVar4 = *(int *)(local_890.hit + 0x18);
                      iVar1 = *(int *)(local_890.hit + 0x1c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xd0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x10) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xd0);
                      *(uint *)(local_890.ray + 0xd4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xd4);
                      *(uint *)(local_890.ray + 0xd8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xd8);
                      *(uint *)(local_890.ray + 0xdc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xdc);
                      iVar3 = *(int *)(local_890.hit + 0x24);
                      iVar4 = *(int *)(local_890.hit + 0x28);
                      iVar1 = *(int *)(local_890.hit + 0x2c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xe0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x20) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xe0);
                      *(uint *)(local_890.ray + 0xe4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xe4);
                      *(uint *)(local_890.ray + 0xe8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xe8);
                      *(uint *)(local_890.ray + 0xec) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xec);
                      iVar3 = *(int *)(local_890.hit + 0x34);
                      iVar4 = *(int *)(local_890.hit + 0x38);
                      iVar1 = *(int *)(local_890.hit + 0x3c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xf0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x30) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xf0);
                      *(uint *)(local_890.ray + 0xf4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xf4);
                      *(uint *)(local_890.ray + 0xf8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xf8);
                      *(uint *)(local_890.ray + 0xfc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xfc);
                      iVar3 = *(int *)(local_890.hit + 0x44);
                      iVar4 = *(int *)(local_890.hit + 0x48);
                      iVar1 = *(int *)(local_890.hit + 0x4c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0x100) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x40) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0x100);
                      *(uint *)(local_890.ray + 0x104) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0x104);
                      *(uint *)(local_890.ray + 0x108) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0x108);
                      *(uint *)(local_890.ray + 0x10c) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0x10c);
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x50));
                      *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar83;
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x60));
                      *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x70));
                      *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x80));
                      *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar83;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar169;
                  break;
                }
              }
              lVar74 = lVar74 + -1;
            } while (lVar74 != 0);
            uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar150._4_4_ = uVar139;
            auVar150._0_4_ = uVar139;
            auVar150._8_4_ = uVar139;
            auVar150._12_4_ = uVar139;
            auVar150._16_4_ = uVar139;
            auVar150._20_4_ = uVar139;
            auVar150._24_4_ = uVar139;
            auVar150._28_4_ = uVar139;
            auVar62._4_4_ = fStack_35c;
            auVar62._0_4_ = local_360;
            auVar62._8_4_ = fStack_358;
            auVar62._12_4_ = fStack_354;
            auVar62._16_4_ = fStack_350;
            auVar62._20_4_ = fStack_34c;
            auVar62._24_4_ = fStack_348;
            auVar62._28_4_ = fStack_344;
            uVar17 = vcmpps_avx512vl(auVar150,auVar62,0xd);
            bVar73 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar73 & (byte)uVar17;
          } while (bVar73 != 0);
          auVar252 = ZEXT3264(local_720);
          uVar69 = (ulong)local_9d0;
          auVar94 = local_2c0;
        }
        bVar73 = local_380[0] | (byte)uVar69;
        auVar165._0_4_ = (float)local_6e0._0_4_ + auVar94._0_4_;
        auVar165._4_4_ = (float)local_6e0._4_4_ + auVar94._4_4_;
        auVar165._8_4_ = fStack_6d8 + auVar94._8_4_;
        auVar165._12_4_ = fStack_6d4 + auVar94._12_4_;
        auVar165._16_4_ = fStack_6d0 + auVar94._16_4_;
        auVar165._20_4_ = fStack_6cc + auVar94._20_4_;
        auVar165._24_4_ = fStack_6c8 + auVar94._24_4_;
        auVar165._28_4_ = fStack_6c4 + auVar94._28_4_;
        uVar17 = vcmpps_avx512vl(auVar165,auVar150,2);
        bVar66 = (byte)uVar19 & bVar66 & (byte)uVar17;
        auVar166._8_4_ = 2;
        auVar166._0_8_ = 0x200000002;
        auVar166._12_4_ = 2;
        auVar166._16_4_ = 2;
        auVar166._20_4_ = 2;
        auVar166._24_4_ = 2;
        auVar166._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar166,auVar40);
        auVar128._0_4_ = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar9 = (bool)(bVar73 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar9 * auVar96._16_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar9 * auVar96._20_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar73 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar9 * auVar96._24_4_ | (uint)!bVar9 * 2;
        auVar128._28_4_ = (uint)(bVar73 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_320,auVar128,5);
        bVar73 = (byte)uVar17 & bVar66;
        fVar138 = (float)local_6e0._0_4_;
        fVar167 = (float)local_6e0._4_4_;
        fVar169 = fStack_6d8;
        fVar171 = fStack_6d4;
        fVar152 = fStack_6d0;
        fVar173 = fStack_6cc;
        fVar175 = fStack_6c8;
        fVar205 = fStack_6c4;
        if (bVar73 != 0) {
          local_380 = auVar128;
          auVar86 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar84 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar85 = vminps_avx(auVar86,auVar84);
          auVar86 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vmaxps_avx(auVar83,auVar86);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar83 = vandps_avx(auVar85,auVar188);
          auVar86 = vandps_avx(auVar84,auVar188);
          auVar83 = vmaxps_avx(auVar83,auVar86);
          auVar86 = vmovshdup_avx(auVar83);
          auVar86 = vmaxss_avx(auVar86,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar86);
          fVar138 = auVar83._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar84,auVar84,0xff);
          local_360 = (float)local_6e0._0_4_ + local_300._0_4_;
          fStack_35c = (float)local_6e0._4_4_ + local_300._4_4_;
          fStack_358 = fStack_6d8 + local_300._8_4_;
          fStack_354 = fStack_6d4 + local_300._12_4_;
          fStack_350 = fStack_6d0 + local_300._16_4_;
          fStack_34c = fStack_6cc + local_300._20_4_;
          fStack_348 = fStack_6c8 + local_300._24_4_;
          fStack_344 = fStack_6c4 + local_300._28_4_;
          _local_600 = local_300;
          do {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar151,_local_600);
            auVar129._0_4_ =
                 (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar9 * auVar96._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar73 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar9 * auVar96._20_4_ | (uint)!bVar9 * 0x7f800000;
            auVar129._24_4_ =
                 (uint)(bVar73 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar96 = vminps_avx(auVar129,auVar96);
            auVar94 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar94);
            auVar94 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar94);
            uVar17 = vcmpps_avx512vl(auVar129,auVar96,0);
            bVar67 = (byte)uVar17 & bVar73;
            bVar77 = bVar73;
            if (bVar67 != 0) {
              bVar77 = bVar67;
            }
            iVar2 = 0;
            for (uVar80 = (uint)bVar77; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar217 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar2 << 2)));
            fVar169 = local_9c4;
            fVar167 = *(float *)(local_2e0 + (uint)(iVar2 << 2));
            uVar139 = 0;
            uVar236 = 0;
            uVar237 = 0;
            if ((float)local_740._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar2 << 2)));
              local_7c0._0_16_ = ZEXT416((uint)*(float *)(local_2e0 + (uint)(iVar2 << 2)));
              fVar169 = sqrtf((float)local_740._0_4_);
              auVar217 = ZEXT1664(local_7a0._0_16_);
              fVar167 = (float)local_7c0._0_4_;
              uVar139 = local_7c0._4_4_;
              uVar236 = local_7c0._8_4_;
              uVar237 = local_7c0._12_4_;
            }
            lVar74 = 5;
            do {
              auVar96 = local_7c0;
              auVar144._4_4_ = fVar167;
              auVar144._0_4_ = fVar167;
              auVar144._8_4_ = fVar167;
              auVar144._12_4_ = fVar167;
              auVar86 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_730);
              fVar152 = auVar217._0_4_;
              fVar171 = 1.0 - fVar152;
              auVar189._0_4_ = local_5c0._0_4_ * fVar152;
              auVar189._4_4_ = local_5c0._4_4_ * fVar152;
              auVar189._8_4_ = local_5c0._8_4_ * fVar152;
              auVar189._12_4_ = local_5c0._12_4_ * fVar152;
              local_4e0._0_16_ = ZEXT416((uint)fVar171);
              auVar208._4_4_ = fVar171;
              auVar208._0_4_ = fVar171;
              auVar208._8_4_ = fVar171;
              auVar208._12_4_ = fVar171;
              auVar83 = vfmadd231ps_fma(auVar189,auVar208,local_580._0_16_);
              auVar213._0_4_ = local_5a0._0_4_ * fVar152;
              auVar213._4_4_ = local_5a0._4_4_ * fVar152;
              auVar213._8_4_ = local_5a0._8_4_ * fVar152;
              auVar213._12_4_ = local_5a0._12_4_ * fVar152;
              auVar84 = vfmadd231ps_fma(auVar213,auVar208,local_5c0._0_16_);
              auVar220._0_4_ = fVar152 * (float)local_5e0._0_4_;
              auVar220._4_4_ = fVar152 * (float)local_5e0._4_4_;
              auVar220._8_4_ = fVar152 * fStack_5d8;
              auVar220._12_4_ = fVar152 * fStack_5d4;
              auVar85 = vfmadd231ps_fma(auVar220,auVar208,local_5a0._0_16_);
              auVar227._0_4_ = fVar152 * auVar84._0_4_;
              auVar227._4_4_ = fVar152 * auVar84._4_4_;
              auVar227._8_4_ = fVar152 * auVar84._8_4_;
              auVar227._12_4_ = fVar152 * auVar84._12_4_;
              auVar83 = vfmadd231ps_fma(auVar227,auVar208,auVar83);
              auVar190._0_4_ = fVar152 * auVar85._0_4_;
              auVar190._4_4_ = fVar152 * auVar85._4_4_;
              auVar190._8_4_ = fVar152 * auVar85._8_4_;
              auVar190._12_4_ = fVar152 * auVar85._12_4_;
              auVar84 = vfmadd231ps_fma(auVar190,auVar208,auVar84);
              auVar214._0_4_ = fVar152 * auVar84._0_4_;
              auVar214._4_4_ = fVar152 * auVar84._4_4_;
              auVar214._8_4_ = fVar152 * auVar84._8_4_;
              auVar214._12_4_ = fVar152 * auVar84._12_4_;
              auVar85 = vfmadd231ps_fma(auVar214,auVar83,auVar208);
              auVar83 = vsubps_avx(auVar84,auVar83);
              auVar26._8_4_ = 0x40400000;
              auVar26._0_8_ = 0x4040000040400000;
              auVar26._12_4_ = 0x40400000;
              auVar84 = vmulps_avx512vl(auVar83,auVar26);
              _local_4c0 = auVar85;
              auVar83 = vsubps_avx(auVar86,auVar85);
              local_760._0_16_ = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              local_6a0._0_16_ = auVar83;
              local_7a0._0_16_ = auVar217._0_16_;
              local_7c0._4_4_ = uVar139;
              local_7c0._0_4_ = fVar167;
              local_7c0._8_4_ = uVar236;
              local_7c0._16_16_ = auVar96._16_16_;
              local_7c0._12_4_ = uVar237;
              if (auVar83._0_4_ < 0.0) {
                auVar235._0_4_ = sqrtf(auVar83._0_4_);
                auVar235._4_60_ = extraout_var_01;
                auVar83 = auVar235._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_500._0_16_ = vdpps_avx(auVar84,auVar84,0x7f);
              fVar167 = local_500._0_4_;
              auVar191._4_12_ = ZEXT812(0) << 0x20;
              auVar191._0_4_ = fVar167;
              local_780._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              fVar171 = local_780._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(local_500._0_16_,auVar27);
              auVar86 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar86._0_4_;
              local_6c0._0_4_ = auVar83._0_4_;
              if (fVar167 < auVar85._0_4_) {
                auVar241._0_4_ = sqrtf(fVar167);
                auVar241._4_60_ = extraout_var_02;
                auVar83 = ZEXT416((uint)local_6c0._0_4_);
                auVar86 = auVar241._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar152 = local_780._0_4_;
              fVar167 = fVar171 * 1.5 + fVar167 * -0.5 * fVar152 * fVar152 * fVar152;
              auVar238._0_4_ = auVar84._0_4_ * fVar167;
              auVar238._4_4_ = auVar84._4_4_ * fVar167;
              auVar238._8_4_ = auVar84._8_4_ * fVar167;
              auVar238._12_4_ = auVar84._12_4_ * fVar167;
              local_780._0_16_ = vdpps_avx(local_760._0_16_,auVar238,0x7f);
              auVar87 = vaddss_avx512f(auVar83,ZEXT416(0x3f800000));
              auVar145._0_4_ = local_780._0_4_ * local_780._0_4_;
              auVar145._4_4_ = local_780._4_4_ * local_780._4_4_;
              auVar145._8_4_ = local_780._8_4_ * local_780._8_4_;
              auVar145._12_4_ = local_780._12_4_ * local_780._12_4_;
              auVar85 = vsubps_avx(local_6a0._0_16_,auVar145);
              fVar171 = auVar85._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar171;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar88 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              auVar82 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar76 = fVar171 == 0.0;
              uVar75 = fVar171 < 0.0;
              if ((bool)uVar75) {
                local_650 = fVar167;
                fStack_64c = fVar167;
                fStack_648 = fVar167;
                fStack_644 = fVar167;
                local_640 = auVar238;
                local_630 = auVar81;
                fVar171 = sqrtf(fVar171);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar83 = ZEXT416((uint)local_6c0._0_4_);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar238 = local_640;
                auVar81 = local_630;
                fVar167 = local_650;
                fVar152 = fStack_64c;
                fVar173 = fStack_648;
                fVar175 = fStack_644;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar171 = auVar85._0_4_;
                fVar152 = fVar167;
                fVar173 = fVar167;
                fVar175 = fVar167;
              }
              auVar235 = ZEXT3264(local_8c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar241 = ZEXT3264(local_7e0);
              auVar242 = ZEXT3264(local_800);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_820);
              auVar247 = ZEXT3264(local_960);
              auVar248 = ZEXT3264(local_840);
              auVar249 = ZEXT3264(local_980);
              auVar250 = ZEXT3264(local_860);
              auVar253 = ZEXT3264(local_9a0);
              auVar254 = ZEXT3264(local_9c0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                        local_4e0._0_16_);
              fVar205 = auVar85._0_4_ * 6.0;
              fVar153 = local_7a0._0_4_ * 6.0;
              auVar192._0_4_ = fVar153 * (float)local_5e0._0_4_;
              auVar192._4_4_ = fVar153 * (float)local_5e0._4_4_;
              auVar192._8_4_ = fVar153 * fStack_5d8;
              auVar192._12_4_ = fVar153 * fStack_5d4;
              auVar160._4_4_ = fVar205;
              auVar160._0_4_ = fVar205;
              auVar160._8_4_ = fVar205;
              auVar160._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar160,auVar192,local_5a0._0_16_);
              auVar251 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_7a0._0_16_);
              fVar205 = auVar251._0_4_ * 6.0;
              auVar193._4_4_ = fVar205;
              auVar193._0_4_ = fVar205;
              auVar193._8_4_ = fVar205;
              auVar193._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar193,auVar85,local_5c0._0_16_);
              fVar205 = local_4e0._0_4_ * 6.0;
              auVar161._4_4_ = fVar205;
              auVar161._0_4_ = fVar205;
              auVar161._8_4_ = fVar205;
              auVar161._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar161,auVar85,local_580._0_16_);
              auVar194._0_4_ = auVar85._0_4_ * (float)local_500._0_4_;
              auVar194._4_4_ = auVar85._4_4_ * (float)local_500._0_4_;
              auVar194._8_4_ = auVar85._8_4_ * (float)local_500._0_4_;
              auVar194._12_4_ = auVar85._12_4_ * (float)local_500._0_4_;
              auVar85 = vdpps_avx(auVar84,auVar85,0x7f);
              fVar205 = auVar85._0_4_;
              auVar162._0_4_ = auVar84._0_4_ * fVar205;
              auVar162._4_4_ = auVar84._4_4_ * fVar205;
              auVar162._8_4_ = auVar84._8_4_ * fVar205;
              auVar162._12_4_ = auVar84._12_4_ * fVar205;
              auVar85 = vsubps_avx(auVar194,auVar162);
              fVar205 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(auVar84,auVar28);
              auVar215._0_4_ = fVar167 * auVar85._0_4_ * fVar205;
              auVar215._4_4_ = fVar152 * auVar85._4_4_ * fVar205;
              auVar215._8_4_ = fVar173 * auVar85._8_4_ * fVar205;
              auVar215._12_4_ = fVar175 * auVar85._12_4_ * fVar205;
              auVar85 = vdpps_avx(auVar89,auVar238,0x7f);
              auVar251 = vmaxss_avx(ZEXT416((uint)fVar138),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * fVar169 * 1.9073486e-06)
                                           ));
              auVar90 = vdivss_avx512f(ZEXT416((uint)fVar138),auVar86);
              auVar86 = vdpps_avx(local_760._0_16_,auVar215,0x7f);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar138),auVar251);
              vfmadd213ss_avx512f(auVar87,auVar90,auVar83);
              auVar83 = vdpps_avx(local_730,auVar238,0x7f);
              fVar167 = auVar85._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_760._0_16_,auVar89,0x7f);
              auVar87 = vmulss_avx512f(auVar82,auVar81);
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              auVar85 = vdpps_avx(local_760._0_16_,local_730,0x7f);
              auVar81 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar87._0_4_ * auVar81._0_4_)));
              auVar87 = vfnmadd231ss_avx512f(auVar86,local_780._0_16_,ZEXT416((uint)fVar167));
              auVar88 = vfnmadd231ss_avx512f(auVar85,local_780._0_16_,auVar83);
              auVar86 = vpermilps_avx(_local_4c0,0xff);
              fVar171 = fVar171 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar84,auVar84,0xff);
              auVar85 = vfmsub213ss_fma(auVar87,auVar81,auVar86);
              fVar152 = auVar88._0_4_ * auVar81._0_4_;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar167),ZEXT416((uint)fVar152));
              fVar173 = auVar81._0_4_;
              auVar228._0_4_ = fVar152 / fVar173;
              auVar228._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar221._0_4_ = auVar85._0_4_ / fVar173;
              auVar221._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(local_780._0_16_,auVar228);
              auVar81 = vmulss_avx512f(local_780._0_16_,auVar221);
              fVar152 = local_7a0._0_4_ - (auVar85._0_4_ - fVar171 * (auVar83._0_4_ / fVar173));
              auVar217 = ZEXT464((uint)fVar152);
              fVar167 = (float)local_7c0._0_4_ - (fVar171 * (fVar167 / fVar173) - auVar81._0_4_);
              uVar139 = 0;
              uVar236 = 0;
              uVar237 = 0;
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(local_780._0_16_,auVar29);
              auVar83 = vucomiss_avx512f(auVar83);
              if (!(bool)uVar75 && !(bool)uVar76) {
                auVar83 = vaddss_avx512f(auVar251,auVar83);
                auVar83 = vfmadd231ss_fma(auVar83,local_660,ZEXT416(0x36000000));
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar30);
                if (auVar85._0_4_ < auVar83._0_4_) {
                  fVar167 = fVar167 + (float)local_670._0_4_;
                  if ((((fVar167 < fVar206) ||
                       (fVar169 = *(float *)(ray + k * 4 + 0x80), fVar169 < fVar167)) ||
                      (fVar152 < 0.0)) || (1.0 < fVar152)) break;
                  auVar195._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar195._0_4_ = local_6a0._0_4_;
                  auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar195);
                  fVar171 = auVar83._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar72].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar171 = fVar171 * 1.5 +
                            (float)local_6a0._0_4_ * -0.5 * fVar171 * fVar171 * fVar171;
                  auVar196._0_4_ = local_760._0_4_ * fVar171;
                  auVar196._4_4_ = local_760._4_4_ * fVar171;
                  auVar196._8_4_ = local_760._8_4_ * fVar171;
                  auVar196._12_4_ = local_760._12_4_ * fVar171;
                  auVar85 = vfmadd213ps_fma(auVar86,auVar196,auVar84);
                  auVar83 = vshufps_avx(auVar196,auVar196,0xc9);
                  auVar86 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar197._0_4_ = auVar196._0_4_ * auVar86._0_4_;
                  auVar197._4_4_ = auVar196._4_4_ * auVar86._4_4_;
                  auVar197._8_4_ = auVar196._8_4_ * auVar86._8_4_;
                  auVar197._12_4_ = auVar196._12_4_ * auVar86._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar197,auVar84,auVar83);
                  auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar86 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar146._0_4_ = auVar85._0_4_ * auVar84._0_4_;
                  auVar146._4_4_ = auVar85._4_4_ * auVar84._4_4_;
                  auVar146._8_4_ = auVar85._8_4_ * auVar84._8_4_;
                  auVar146._12_4_ = auVar85._12_4_ * auVar84._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar146,auVar83,auVar86);
                  uVar139 = auVar83._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar167;
                    uVar236 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar236;
                    uVar236 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar236;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar139;
                    *(float *)(ray + k * 4 + 0xf0) = fVar152;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                    *(uint *)(ray + k * 4 + 0x120) = uVar72;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                  auStack_450 = vshufps_avx(auVar83,auVar83,0xaa);
                  local_440 = uVar139;
                  uStack_43c = uVar139;
                  uStack_438 = uVar139;
                  uStack_434 = uVar139;
                  local_430 = fVar152;
                  fStack_42c = fVar152;
                  fStack_428 = fVar152;
                  fStack_424 = fVar152;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar167;
                  local_9e0 = local_490;
                  local_890.valid = (int *)local_9e0;
                  local_890.geometryUserPtr = pGVar7->userPtr;
                  local_890.context = context->user;
                  local_890.hit = local_460;
                  local_890.N = 4;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_890);
                    auVar254 = ZEXT3264(local_9c0);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar250 = ZEXT3264(local_860);
                    auVar249 = ZEXT3264(local_980);
                    auVar248 = ZEXT3264(local_840);
                    auVar247 = ZEXT3264(local_960);
                    auVar246 = ZEXT3264(local_820);
                    auVar245 = ZEXT3264(local_940);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar242 = ZEXT3264(local_800);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar256 = ZEXT3264(local_8e0);
                    auVar235 = ZEXT3264(local_8c0);
                  }
                  uVar78 = vptestmd_avx512vl(local_9e0,local_9e0);
                  if ((uVar78 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_890);
                      auVar254 = ZEXT3264(local_9c0);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar250 = ZEXT3264(local_860);
                      auVar249 = ZEXT3264(local_980);
                      auVar248 = ZEXT3264(local_840);
                      auVar247 = ZEXT3264(local_960);
                      auVar246 = ZEXT3264(local_820);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar242 = ZEXT3264(local_800);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar235 = ZEXT3264(local_8c0);
                    }
                    uVar78 = vptestmd_avx512vl(local_9e0,local_9e0);
                    uVar78 = uVar78 & 0xf;
                    bVar77 = (byte)uVar78;
                    if (bVar77 != 0) {
                      iVar3 = *(int *)(local_890.hit + 4);
                      iVar4 = *(int *)(local_890.hit + 8);
                      iVar1 = *(int *)(local_890.hit + 0xc);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xc0) =
                           (uint)(bVar77 & 1) * *(int *)local_890.hit |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xc0);
                      *(uint *)(local_890.ray + 0xc4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xc4);
                      *(uint *)(local_890.ray + 200) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 200);
                      *(uint *)(local_890.ray + 0xcc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xcc);
                      iVar3 = *(int *)(local_890.hit + 0x14);
                      iVar4 = *(int *)(local_890.hit + 0x18);
                      iVar1 = *(int *)(local_890.hit + 0x1c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xd0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x10) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xd0);
                      *(uint *)(local_890.ray + 0xd4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xd4);
                      *(uint *)(local_890.ray + 0xd8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xd8);
                      *(uint *)(local_890.ray + 0xdc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xdc);
                      iVar3 = *(int *)(local_890.hit + 0x24);
                      iVar4 = *(int *)(local_890.hit + 0x28);
                      iVar1 = *(int *)(local_890.hit + 0x2c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xe0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x20) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xe0);
                      *(uint *)(local_890.ray + 0xe4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xe4);
                      *(uint *)(local_890.ray + 0xe8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xe8);
                      *(uint *)(local_890.ray + 0xec) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xec);
                      iVar3 = *(int *)(local_890.hit + 0x34);
                      iVar4 = *(int *)(local_890.hit + 0x38);
                      iVar1 = *(int *)(local_890.hit + 0x3c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0xf0) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x30) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0xf0);
                      *(uint *)(local_890.ray + 0xf4) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0xf4);
                      *(uint *)(local_890.ray + 0xf8) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0xf8);
                      *(uint *)(local_890.ray + 0xfc) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0xfc);
                      iVar3 = *(int *)(local_890.hit + 0x44);
                      iVar4 = *(int *)(local_890.hit + 0x48);
                      iVar1 = *(int *)(local_890.hit + 0x4c);
                      bVar9 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar11 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_890.ray + 0x100) =
                           (uint)(bVar77 & 1) * *(int *)(local_890.hit + 0x40) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_890.ray + 0x100);
                      *(uint *)(local_890.ray + 0x104) =
                           (uint)bVar9 * iVar3 | (uint)!bVar9 * *(int *)(local_890.ray + 0x104);
                      *(uint *)(local_890.ray + 0x108) =
                           (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_890.ray + 0x108);
                      *(uint *)(local_890.ray + 0x10c) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_890.ray + 0x10c);
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x50));
                      *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar83;
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x60));
                      *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x70));
                      *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_890.hit + 0x80));
                      *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar83;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar169;
                  break;
                }
              }
              lVar74 = lVar74 + -1;
            } while (lVar74 != 0);
            uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar150._4_4_ = uVar139;
            auVar150._0_4_ = uVar139;
            auVar150._8_4_ = uVar139;
            auVar150._12_4_ = uVar139;
            auVar150._16_4_ = uVar139;
            auVar150._20_4_ = uVar139;
            auVar150._24_4_ = uVar139;
            auVar150._28_4_ = uVar139;
            auVar63._4_4_ = fStack_35c;
            auVar63._0_4_ = local_360;
            auVar63._8_4_ = fStack_358;
            auVar63._12_4_ = fStack_354;
            auVar63._16_4_ = fStack_350;
            auVar63._20_4_ = fStack_34c;
            auVar63._24_4_ = fStack_348;
            auVar63._28_4_ = fStack_344;
            uVar17 = vcmpps_avx512vl(auVar150,auVar63,0xd);
            bVar73 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar73 & (byte)uVar17;
          } while (bVar73 != 0);
          auVar252 = ZEXT3264(local_720);
          auVar128 = local_380;
          fVar138 = (float)local_6e0._0_4_;
          fVar167 = (float)local_6e0._4_4_;
          fVar169 = fStack_6d8;
          fVar171 = fStack_6d4;
          fVar152 = fStack_6d0;
          fVar173 = fStack_6cc;
          fVar175 = fStack_6c8;
          fVar205 = fStack_6c4;
        }
        auVar217 = ZEXT3264(local_700);
        uVar19 = vpcmpgtd_avx512vl(auVar128,local_320);
        uVar20 = vpcmpd_avx512vl(local_320,local_2a0,1);
        auVar203._0_4_ = fVar138 + (float)local_200._0_4_;
        auVar203._4_4_ = fVar167 + (float)local_200._4_4_;
        auVar203._8_4_ = fVar169 + fStack_1f8;
        auVar203._12_4_ = fVar171 + fStack_1f4;
        auVar203._16_4_ = fVar152 + fStack_1f0;
        auVar203._20_4_ = fVar173 + fStack_1ec;
        auVar203._24_4_ = fVar175 + fStack_1e8;
        auVar203._28_4_ = fVar205 + fStack_1e4;
        uVar17 = vcmpps_avx512vl(auVar203,auVar150,2);
        bVar70 = bVar70 & (byte)uVar20 & (byte)uVar17;
        auVar204._0_4_ = fVar138 + local_300._0_4_;
        auVar204._4_4_ = fVar167 + local_300._4_4_;
        auVar204._8_4_ = fVar169 + local_300._8_4_;
        auVar204._12_4_ = fVar171 + local_300._12_4_;
        auVar204._16_4_ = fVar152 + local_300._16_4_;
        auVar204._20_4_ = fVar173 + local_300._20_4_;
        auVar204._24_4_ = fVar175 + local_300._24_4_;
        auVar204._28_4_ = fVar205 + local_300._28_4_;
        uVar17 = vcmpps_avx512vl(auVar204,auVar150,2);
        bVar66 = bVar66 & (byte)uVar19 & (byte)uVar17 | bVar70;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar96);
        auVar231 = ZEXT3264(local_560);
        pPVar71 = local_618;
        prim = local_610;
        if (bVar66 != 0) {
          abStack_180[uVar68 * 0x60] = bVar66;
          auVar130._0_4_ =
               (uint)(bVar70 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar70 & 1) * (int)local_300._0_4_;
          bVar9 = (bool)(bVar70 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar9 * local_200._4_4_ | (uint)!bVar9 * (int)local_300._4_4_;
          bVar9 = (bool)(bVar70 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)local_300._8_4_;
          bVar9 = (bool)(bVar70 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar9 * (int)fStack_1f4 | (uint)!bVar9 * (int)local_300._12_4_;
          bVar9 = (bool)(bVar70 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar9 * (int)fStack_1f0 | (uint)!bVar9 * (int)local_300._16_4_;
          bVar9 = (bool)(bVar70 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar9 * (int)fStack_1ec | (uint)!bVar9 * (int)local_300._20_4_;
          auVar130._24_4_ =
               (uint)(bVar70 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar70 >> 6) * (int)local_300._24_4_;
          auVar130._28_4_ = local_300._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar68 * 0x60) = auVar130;
          uVar78 = vmovlps_avx(local_330);
          (&uStack_140)[uVar68 * 0xc] = uVar78;
          aiStack_138[uVar68 * 0x18] = local_9cc + 1;
          uVar68 = (ulong)((int)uVar68 + 1);
        }
      }
    }
    do {
      uVar80 = (uint)uVar68;
      uVar68 = (ulong)(uVar80 - 1);
      if (uVar80 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar42._4_4_ = uVar5;
        auVar42._0_4_ = uVar5;
        auVar42._8_4_ = uVar5;
        auVar42._12_4_ = uVar5;
        auVar42._16_4_ = uVar5;
        auVar42._20_4_ = uVar5;
        auVar42._24_4_ = uVar5;
        auVar42._28_4_ = uVar5;
        uVar17 = vcmpps_avx512vl(local_280,auVar42,2);
        uVar72 = (uint)local_608 & (uint)uVar17;
        local_608 = (ulong)uVar72;
        if (uVar72 == 0) {
          return;
        }
        goto LAB_01c6ea9f;
      }
      lVar74 = uVar68 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar74);
      auVar163._0_4_ = fVar138 + auVar96._0_4_;
      auVar163._4_4_ = fVar167 + auVar96._4_4_;
      auVar163._8_4_ = fVar169 + auVar96._8_4_;
      auVar163._12_4_ = fVar171 + auVar96._12_4_;
      auVar163._16_4_ = fVar152 + auVar96._16_4_;
      auVar163._20_4_ = fVar173 + auVar96._20_4_;
      auVar163._24_4_ = fVar175 + auVar96._24_4_;
      auVar163._28_4_ = fVar205 + auVar96._28_4_;
      uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar41._4_4_ = uVar139;
      auVar41._0_4_ = uVar139;
      auVar41._8_4_ = uVar139;
      auVar41._12_4_ = uVar139;
      auVar41._16_4_ = uVar139;
      auVar41._20_4_ = uVar139;
      auVar41._24_4_ = uVar139;
      auVar41._28_4_ = uVar139;
      uVar17 = vcmpps_avx512vl(auVar163,auVar41,2);
      uVar79 = (uint)uVar17 & (uint)abStack_180[lVar74];
    } while (uVar79 == 0);
    uVar78 = (&uStack_140)[uVar68 * 0xc];
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar78;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar201,auVar96);
    bVar66 = (byte)uVar79;
    auVar126._0_4_ =
         (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)auVar96._0_4_;
    bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar9 * auVar94._4_4_ | (uint)!bVar9 * (int)auVar96._4_4_;
    bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar9 * auVar94._8_4_ | (uint)!bVar9 * (int)auVar96._8_4_;
    bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar9 * auVar94._12_4_ | (uint)!bVar9 * (int)auVar96._12_4_;
    bVar9 = (bool)((byte)(uVar79 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar9 * auVar94._16_4_ | (uint)!bVar9 * (int)auVar96._16_4_;
    bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar9 * auVar94._20_4_ | (uint)!bVar9 * (int)auVar96._20_4_;
    bVar9 = (bool)((byte)(uVar79 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar9 * auVar94._24_4_ | (uint)!bVar9 * (int)auVar96._24_4_;
    auVar126._28_4_ =
         (uVar79 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar79 >> 7,0) * (int)auVar96._28_4_;
    auVar96 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar96 = vminps_avx(auVar126,auVar96);
    auVar94 = vshufpd_avx(auVar96,auVar96,5);
    auVar96 = vminps_avx(auVar96,auVar94);
    auVar94 = vpermpd_avx2(auVar96,0x4e);
    auVar96 = vminps_avx(auVar96,auVar94);
    uVar17 = vcmpps_avx512vl(auVar126,auVar96,0);
    bVar70 = (byte)uVar17 & bVar66;
    if (bVar70 != 0) {
      uVar79 = (uint)bVar70;
    }
    uVar131 = 0;
    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    local_9cc = aiStack_138[uVar68 * 0x18];
    bVar66 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar66;
    abStack_180[lVar74] = bVar66;
    if (bVar66 == 0) {
      uVar80 = uVar80 - 1;
    }
    uVar139 = (undefined4)uVar78;
    auVar147._4_4_ = uVar139;
    auVar147._0_4_ = uVar139;
    auVar147._8_4_ = uVar139;
    auVar147._12_4_ = uVar139;
    auVar147._16_4_ = uVar139;
    auVar147._20_4_ = uVar139;
    auVar147._24_4_ = uVar139;
    auVar147._28_4_ = uVar139;
    auVar83 = vmovshdup_avx(auVar154);
    auVar83 = vsubps_avx(auVar83,auVar154);
    auVar164._0_4_ = auVar83._0_4_;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar83 = vfmadd132ps_fma(auVar164,auVar147,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar83);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_460 + (ulong)uVar131 * 4);
    uVar68 = (ulong)uVar80;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }